

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  uint uVar76;
  byte bVar77;
  byte bVar78;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ulong uVar79;
  undefined8 in_R11;
  byte bVar80;
  bool bVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float pp;
  float fVar141;
  float fVar142;
  undefined4 uVar143;
  float fVar158;
  float fVar159;
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar145 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar179;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar180;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar199;
  float fVar200;
  undefined1 auVar193 [32];
  float fVar201;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar220;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar241;
  float fVar242;
  undefined1 auVar237 [16];
  float fVar243;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  float fVar248;
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_944;
  int local_934;
  ulong local_930;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  uint local_768;
  uint local_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_650 [16];
  undefined8 local_640;
  undefined4 local_638;
  float local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  uint local_624;
  uint local_620;
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [16];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar124 [32];
  
  uVar79 = (ulong)(byte)prim[1];
  fVar202 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar90 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar178 = fVar202 * auVar90._0_4_;
  fVar141 = fVar202 * (ray->dir).field_0.m128[0];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar86);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar87);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar91);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar101 = vpmovsxbd_avx2(auVar92);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar79 * 0xc + 6);
  auVar102 = vpmovsxbd_avx2(auVar84);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar79 * 0xd + 6);
  auVar106 = vpmovsxbd_avx2(auVar88);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar79 * 0x12 + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar79 * 0x13 + 6);
  auVar105 = vpmovsxbd_avx2(auVar93);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar79 * 0x14 + 6);
  auVar96 = vpmovsxbd_avx2(auVar89);
  auVar103 = vcvtdq2ps_avx(auVar105);
  auVar104 = vcvtdq2ps_avx(auVar96);
  auVar252 = ZEXT3264(auVar104);
  auVar117._4_4_ = fVar141;
  auVar117._0_4_ = fVar141;
  auVar117._8_4_ = fVar141;
  auVar117._12_4_ = fVar141;
  auVar117._16_4_ = fVar141;
  auVar117._20_4_ = fVar141;
  auVar117._24_4_ = fVar141;
  auVar117._28_4_ = fVar141;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  auVar108 = ZEXT1632(CONCAT412(fVar202 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar202 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar202 * (ray->dir).field_0.m128[1],fVar141))));
  auVar107 = vpermps_avx2(auVar119,auVar108);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = vpermps_avx512vl(auVar94,auVar108);
  fVar141 = auVar95._0_4_;
  fVar241 = auVar95._4_4_;
  auVar108._4_4_ = fVar241 * auVar100._4_4_;
  auVar108._0_4_ = fVar141 * auVar100._0_4_;
  fVar242 = auVar95._8_4_;
  auVar108._8_4_ = fVar242 * auVar100._8_4_;
  fVar243 = auVar95._12_4_;
  auVar108._12_4_ = fVar243 * auVar100._12_4_;
  fVar219 = auVar95._16_4_;
  auVar108._16_4_ = fVar219 * auVar100._16_4_;
  fVar220 = auVar95._20_4_;
  auVar108._20_4_ = fVar220 * auVar100._20_4_;
  fVar163 = auVar95._24_4_;
  auVar108._24_4_ = fVar163 * auVar100._24_4_;
  auVar108._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar106._4_4_ * fVar241;
  auVar96._0_4_ = auVar106._0_4_ * fVar141;
  auVar96._8_4_ = auVar106._8_4_ * fVar242;
  auVar96._12_4_ = auVar106._12_4_ * fVar243;
  auVar96._16_4_ = auVar106._16_4_ * fVar219;
  auVar96._20_4_ = auVar106._20_4_ * fVar220;
  auVar96._24_4_ = auVar106._24_4_ * fVar163;
  auVar96._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar104._4_4_ * fVar241;
  auVar105._0_4_ = auVar104._0_4_ * fVar141;
  auVar105._8_4_ = auVar104._8_4_ * fVar242;
  auVar105._12_4_ = auVar104._12_4_ * fVar243;
  auVar105._16_4_ = auVar104._16_4_ * fVar219;
  auVar105._20_4_ = auVar104._20_4_ * fVar220;
  auVar105._24_4_ = auVar104._24_4_ * fVar163;
  auVar105._28_4_ = auVar95._28_4_;
  auVar86 = vfmadd231ps_fma(auVar108,auVar107,auVar97);
  auVar87 = vfmadd231ps_fma(auVar96,auVar107,auVar102);
  auVar91 = vfmadd231ps_fma(auVar105,auVar103,auVar107);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar117,auVar98);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar117,auVar101);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar99,auVar117);
  auVar118._4_4_ = fVar178;
  auVar118._0_4_ = fVar178;
  auVar118._8_4_ = fVar178;
  auVar118._12_4_ = fVar178;
  auVar118._16_4_ = fVar178;
  auVar118._20_4_ = fVar178;
  auVar118._24_4_ = fVar178;
  auVar118._28_4_ = fVar178;
  auVar96 = ZEXT1632(CONCAT412(fVar202 * auVar90._12_4_,
                               CONCAT48(fVar202 * auVar90._8_4_,
                                        CONCAT44(fVar202 * auVar90._4_4_,fVar178))));
  auVar105 = vpermps_avx2(auVar119,auVar96);
  auVar96 = vpermps_avx512vl(auVar94,auVar96);
  fVar202 = auVar96._0_4_;
  fVar141 = auVar96._4_4_;
  auVar107._4_4_ = fVar141 * auVar100._4_4_;
  auVar107._0_4_ = fVar202 * auVar100._0_4_;
  fVar241 = auVar96._8_4_;
  auVar107._8_4_ = fVar241 * auVar100._8_4_;
  fVar242 = auVar96._12_4_;
  auVar107._12_4_ = fVar242 * auVar100._12_4_;
  fVar243 = auVar96._16_4_;
  auVar107._16_4_ = fVar243 * auVar100._16_4_;
  fVar219 = auVar96._20_4_;
  auVar107._20_4_ = fVar219 * auVar100._20_4_;
  fVar220 = auVar96._24_4_;
  auVar107._24_4_ = fVar220 * auVar100._24_4_;
  auVar107._28_4_ = 1;
  auVar94._4_4_ = auVar106._4_4_ * fVar141;
  auVar94._0_4_ = auVar106._0_4_ * fVar202;
  auVar94._8_4_ = auVar106._8_4_ * fVar241;
  auVar94._12_4_ = auVar106._12_4_ * fVar242;
  auVar94._16_4_ = auVar106._16_4_ * fVar243;
  auVar94._20_4_ = auVar106._20_4_ * fVar219;
  auVar94._24_4_ = auVar106._24_4_ * fVar220;
  auVar94._28_4_ = auVar100._28_4_;
  auVar106._4_4_ = auVar104._4_4_ * fVar141;
  auVar106._0_4_ = auVar104._0_4_ * fVar202;
  auVar106._8_4_ = auVar104._8_4_ * fVar241;
  auVar106._12_4_ = auVar104._12_4_ * fVar242;
  auVar106._16_4_ = auVar104._16_4_ * fVar243;
  auVar106._20_4_ = auVar104._20_4_ * fVar219;
  auVar106._24_4_ = auVar104._24_4_ * fVar220;
  auVar106._28_4_ = auVar96._28_4_;
  auVar92 = vfmadd231ps_fma(auVar107,auVar105,auVar97);
  auVar84 = vfmadd231ps_fma(auVar94,auVar105,auVar102);
  auVar88 = vfmadd231ps_fma(auVar106,auVar105,auVar103);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar118,auVar98);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar118,auVar101);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar118,auVar99);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  auVar98 = vandps_avx(ZEXT1632(auVar86),auVar113);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar81 = (bool)((byte)uVar82 & 1);
  auVar95._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._0_4_;
  bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._4_4_;
  bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._8_4_;
  bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar87),auVar113);
  uVar82 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar81 = (bool)((byte)uVar82 & 1);
  auVar109._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._0_4_;
  bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._4_4_;
  bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._8_4_;
  bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar91),auVar113);
  uVar82 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar81 = (bool)((byte)uVar82 & 1);
  auVar98._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar91._0_4_;
  bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar91._4_4_;
  bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar91._8_4_;
  bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar91._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar250 = ZEXT3264(auVar116);
  auVar86 = vfnmadd213ps_fma(auVar95,auVar97,auVar116);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar109);
  auVar87 = vfnmadd213ps_fma(auVar109,auVar97,auVar116);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar98);
  auVar91 = vfnmadd213ps_fma(auVar98,auVar97,auVar116);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar97,auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar92));
  auVar99._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar99._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar99._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar99._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar99._16_4_ = auVar98._16_4_ * 0.0;
  auVar99._20_4_ = auVar98._20_4_ * 0.0;
  auVar99._24_4_ = auVar98._24_4_ * 0.0;
  auVar99._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar92));
  auVar112._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar112._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar112._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar112._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar112._16_4_ = auVar98._16_4_ * 0.0;
  auVar112._20_4_ = auVar98._20_4_ * 0.0;
  auVar112._24_4_ = auVar98._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0xe + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar84));
  auVar103._4_4_ = auVar87._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar87._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar87._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar87._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar84));
  auVar111._0_4_ = auVar87._0_4_ * auVar98._0_4_;
  auVar111._4_4_ = auVar87._4_4_ * auVar98._4_4_;
  auVar111._8_4_ = auVar87._8_4_ * auVar98._8_4_;
  auVar111._12_4_ = auVar87._12_4_ * auVar98._12_4_;
  auVar111._16_4_ = auVar98._16_4_ * 0.0;
  auVar111._20_4_ = auVar98._20_4_ * 0.0;
  auVar111._24_4_ = auVar98._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x15 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar88));
  auVar104._4_4_ = auVar98._4_4_ * auVar91._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar91._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar91._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar91._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar88));
  auVar110._0_4_ = auVar91._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar91._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar91._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar91._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar98._16_4_ * 0.0;
  auVar110._20_4_ = auVar98._20_4_ * 0.0;
  auVar110._24_4_ = auVar98._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar99,auVar112);
  auVar97 = vpminsd_avx2(auVar103,auVar111);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar97 = vpminsd_avx2(auVar104,auVar110);
  uVar143 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar100._4_4_ = uVar143;
  auVar100._0_4_ = uVar143;
  auVar100._8_4_ = uVar143;
  auVar100._12_4_ = uVar143;
  auVar100._16_4_ = uVar143;
  auVar100._20_4_ = uVar143;
  auVar100._24_4_ = uVar143;
  auVar100._28_4_ = uVar143;
  auVar97 = vmaxps_avx512vl(auVar97,auVar100);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar97._8_4_ = 0x3f7ffffa;
  auVar97._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar97._12_4_ = 0x3f7ffffa;
  auVar97._16_4_ = 0x3f7ffffa;
  auVar97._20_4_ = 0x3f7ffffa;
  auVar97._24_4_ = 0x3f7ffffa;
  auVar97._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar98,auVar97);
  auVar98 = vpmaxsd_avx2(auVar99,auVar112);
  auVar97 = vpmaxsd_avx2(auVar103,auVar111);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar97 = vpmaxsd_avx2(auVar104,auVar110);
  fVar202 = ray->tfar;
  auVar101._4_4_ = fVar202;
  auVar101._0_4_ = fVar202;
  auVar101._8_4_ = fVar202;
  auVar101._12_4_ = fVar202;
  auVar101._16_4_ = fVar202;
  auVar101._20_4_ = fVar202;
  auVar101._24_4_ = fVar202;
  auVar101._28_4_ = fVar202;
  auVar97 = vminps_avx512vl(auVar97,auVar101);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar102._8_4_ = 0x3f800003;
  auVar102._0_8_ = 0x3f8000033f800003;
  auVar102._12_4_ = 0x3f800003;
  auVar102._16_4_ = 0x3f800003;
  auVar102._20_4_ = 0x3f800003;
  auVar102._24_4_ = 0x3f800003;
  auVar102._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar102);
  auVar97 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_280,auVar98,2);
  uVar17 = vpcmpgtd_avx512vl(auVar97,_DAT_01fb4ba0);
  local_608 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar17));
  local_610 = prim;
LAB_01a95e25:
  if (local_608 == 0) {
LAB_01a986c0:
    return local_608 != 0;
  }
  lVar19 = 0;
  for (uVar82 = local_608; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar19 = lVar19 + 1;
  }
  local_928 = (ulong)*(uint *)(prim + 2);
  local_930 = (ulong)*(uint *)(prim + lVar19 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[local_928].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_930);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar19 = *(long *)&pGVar3[1].time_range.upper;
  auVar86 = *(undefined1 (*) [16])(lVar19 + (long)p_Var4 * uVar82);
  auVar87 = *(undefined1 (*) [16])(lVar19 + (uVar82 + 1) * (long)p_Var4);
  auVar91 = *(undefined1 (*) [16])(lVar19 + (uVar82 + 2) * (long)p_Var4);
  local_488 = local_608 - 1 & local_608;
  auVar92 = *(undefined1 (*) [16])(lVar19 + (uVar82 + 3) * (long)p_Var4);
  if (local_488 != 0) {
    uVar79 = local_488 - 1 & local_488;
    for (uVar82 = local_488; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    }
    if (uVar79 != 0) {
      for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar225._0_4_ = auVar86._0_4_ + auVar87._0_4_ + auVar91._0_4_ + auVar92._0_4_;
  auVar225._4_4_ = auVar86._4_4_ + auVar87._4_4_ + auVar91._4_4_ + auVar92._4_4_;
  auVar225._8_4_ = auVar86._8_4_ + auVar87._8_4_ + auVar91._8_4_ + auVar92._8_4_;
  auVar225._12_4_ = auVar86._12_4_ + auVar87._12_4_ + auVar91._12_4_ + auVar92._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar90._8_4_ = 0x3e800000;
  auVar90._0_8_ = 0x3e8000003e800000;
  auVar90._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar225,auVar90);
  auVar84 = vsubps_avx(auVar84,(undefined1  [16])aVar1);
  auVar84 = vdpps_avx(auVar84,(undefined1  [16])aVar2,0x7f);
  auVar88 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar93 = ZEXT816(0) << 0x40;
  auVar247 = ZEXT1664(auVar93);
  auVar237._4_12_ = ZEXT812(0) << 0x20;
  auVar237._0_4_ = auVar88._0_4_;
  auVar85 = vrcp14ss_avx512f(auVar93,auVar237);
  auVar88 = vfnmadd213ss_fma(auVar85,auVar88,ZEXT416(0x40000000));
  auVar244 = ZEXT1664(auVar88);
  fVar202 = auVar84._0_4_ * auVar85._0_4_ * auVar88._0_4_;
  local_4f0 = ZEXT416((uint)fVar202);
  auVar226._4_4_ = fVar202;
  auVar226._0_4_ = fVar202;
  auVar226._8_4_ = fVar202;
  auVar226._12_4_ = fVar202;
  fStack_3d0 = fVar202;
  _local_3e0 = auVar226;
  fStack_3cc = fVar202;
  fStack_3c8 = fVar202;
  fStack_3c4 = fVar202;
  auVar84 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar226);
  auVar84 = vblendps_avx(auVar84,auVar93,8);
  auVar86 = vsubps_avx(auVar86,auVar84);
  uVar143 = *(undefined4 *)&(ray->dir).field_0;
  local_3a0._4_4_ = uVar143;
  local_3a0._0_4_ = uVar143;
  local_3a0._8_4_ = uVar143;
  local_3a0._12_4_ = uVar143;
  local_3a0._16_4_ = uVar143;
  local_3a0._20_4_ = uVar143;
  local_3a0._24_4_ = uVar143;
  local_3a0._28_4_ = uVar143;
  auVar240 = ZEXT3264(local_3a0);
  auVar91 = vsubps_avx(auVar91,auVar84);
  local_720 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar263 = ZEXT3264(local_720);
  local_420 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  auVar87 = vsubps_avx(auVar87,auVar84);
  auVar236 = ZEXT1664(auVar87);
  auVar92 = vsubps_avx(auVar92,auVar84);
  auVar230 = ZEXT1664(auVar92);
  local_7e0 = vbroadcastss_avx512vl(auVar86);
  auVar261 = ZEXT3264(local_7e0);
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  local_580 = ZEXT1632(auVar86);
  local_800 = vpermps_avx512vl(auVar121,local_580);
  auVar255 = ZEXT3264(local_800);
  auVar124._8_4_ = 2;
  auVar124._0_8_ = 0x200000002;
  auVar124._12_4_ = 2;
  auVar124._16_4_ = 2;
  auVar124._20_4_ = 2;
  auVar124._24_4_ = 2;
  auVar124._28_4_ = 2;
  local_820 = vpermps_avx512vl(auVar124,local_580);
  auVar256 = ZEXT3264(local_820);
  auVar193._8_4_ = 3;
  auVar193._0_8_ = 0x300000003;
  auVar193._12_4_ = 3;
  auVar193._16_4_ = 3;
  auVar193._20_4_ = 3;
  auVar193._24_4_ = 3;
  auVar193._28_4_ = 3;
  local_840 = vpermps_avx512vl(auVar193,local_580);
  auVar257 = ZEXT3264(local_840);
  local_860 = vbroadcastss_avx512vl(auVar87);
  auVar258 = ZEXT3264(local_860);
  local_5c0 = ZEXT1632(auVar87);
  local_880 = vpermps_avx512vl(auVar121,local_5c0);
  auVar259 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar124,local_5c0);
  auVar260 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar193,local_5c0);
  auVar262 = ZEXT3264(local_8c0);
  local_8e0 = vbroadcastss_avx512vl(auVar91);
  auVar264 = ZEXT3264(local_8e0);
  local_5a0 = ZEXT1632(auVar91);
  local_740 = vpermps_avx512vl(auVar121,local_5a0);
  auVar265 = ZEXT3264(local_740);
  local_760 = vpermps_avx512vl(auVar124,local_5a0);
  auVar266 = ZEXT3264(local_760);
  local_7c0 = vpermps_avx512vl(auVar193,local_5a0);
  auVar267 = ZEXT3264(local_7c0);
  local_900 = vbroadcastss_avx512vl(auVar92);
  auVar268 = ZEXT3264(local_900);
  _local_5e0 = ZEXT1632(auVar92);
  _local_1e0 = vpermps_avx2(auVar121,_local_5e0);
  local_240 = vpermps_avx2(auVar124,_local_5e0);
  local_260 = vpermps_avx512vl(auVar193,_local_5e0);
  auVar98 = vpermps_avx2(auVar124,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  local_220 = vfmadd231ps_avx512vl(auVar98,local_720,local_720);
  auVar86 = vfmadd231ps_fma(local_220,local_3a0,local_3a0);
  local_200 = ZEXT1632(auVar86);
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar86),auVar120);
  uVar76 = 0;
  bVar80 = 0;
  local_944 = 1;
  local_350 = ZEXT816(0x3f80000000000000);
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  do {
    auVar86 = vmovshdup_avx(local_350);
    auVar86 = vsubps_avx(auVar86,local_350);
    auVar144._0_4_ = auVar86._0_4_;
    fVar14 = auVar144._0_4_ * 0.04761905;
    uVar143 = local_350._0_4_;
    local_7a0._4_4_ = uVar143;
    local_7a0._0_4_ = uVar143;
    local_7a0._8_4_ = uVar143;
    local_7a0._12_4_ = uVar143;
    local_7a0._16_4_ = uVar143;
    local_7a0._20_4_ = uVar143;
    local_7a0._24_4_ = uVar143;
    local_7a0._28_4_ = uVar143;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    local_700._16_4_ = auVar144._0_4_;
    local_700._0_16_ = auVar144;
    local_700._20_4_ = auVar144._0_4_;
    local_700._24_4_ = auVar144._0_4_;
    local_700._28_4_ = auVar144._0_4_;
    auVar86 = vfmadd231ps_fma(local_7a0,local_700,_DAT_01f7b040);
    auVar98 = vsubps_avx(auVar250._0_32_,ZEXT1632(auVar86));
    fVar141 = auVar98._0_4_;
    fVar242 = auVar98._4_4_;
    fVar219 = auVar98._8_4_;
    fVar163 = auVar98._12_4_;
    fVar180 = auVar98._16_4_;
    fVar12 = auVar98._20_4_;
    fVar13 = auVar98._24_4_;
    fVar142 = fVar141 * fVar141 * fVar141;
    fVar158 = fVar242 * fVar242 * fVar242;
    auVar38._4_4_ = fVar158;
    auVar38._0_4_ = fVar142;
    fVar159 = fVar219 * fVar219 * fVar219;
    auVar38._8_4_ = fVar159;
    fVar160 = fVar163 * fVar163 * fVar163;
    auVar38._12_4_ = fVar160;
    fVar161 = fVar180 * fVar180 * fVar180;
    auVar38._16_4_ = fVar161;
    fVar162 = fVar12 * fVar12 * fVar12;
    auVar38._20_4_ = fVar162;
    fVar164 = fVar13 * fVar13 * fVar13;
    auVar38._24_4_ = fVar164;
    auVar38._28_4_ = auVar144._0_4_;
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar97 = vmulps_avx512vl(auVar38,auVar99);
    fVar241 = auVar86._0_4_;
    fVar243 = auVar86._4_4_;
    fVar220 = auVar86._8_4_;
    fVar178 = auVar86._12_4_;
    fVar179 = fVar241 * fVar241 * fVar241;
    fVar199 = fVar243 * fVar243 * fVar243;
    fVar200 = fVar220 * fVar220 * fVar220;
    fVar201 = fVar178 * fVar178 * fVar178;
    auVar245._0_4_ = fVar241 * fVar141;
    auVar245._4_4_ = fVar243 * fVar242;
    auVar245._8_4_ = fVar220 * fVar219;
    auVar245._12_4_ = fVar178 * fVar163;
    auVar245._16_4_ = fVar180 * 0.0;
    auVar245._20_4_ = fVar12 * 0.0;
    auVar245._28_36_ = auVar244._28_36_;
    auVar245._24_4_ = fVar13 * 0.0;
    fVar202 = auVar252._28_4_;
    auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar179)
                                                                  ))),auVar99);
    fVar248 = auVar100._28_4_ + auVar144._0_4_;
    auVar39._4_4_ = fVar158 * 0.16666667;
    auVar39._0_4_ = fVar142 * 0.16666667;
    auVar39._8_4_ = fVar159 * 0.16666667;
    auVar39._12_4_ = fVar160 * 0.16666667;
    auVar39._16_4_ = fVar161 * 0.16666667;
    auVar39._20_4_ = fVar162 * 0.16666667;
    auVar39._24_4_ = fVar164 * 0.16666667;
    auVar39._28_4_ = fVar248;
    auVar40._4_4_ =
         (auVar245._4_4_ * fVar242 * 12.0 + auVar245._4_4_ * fVar243 * 6.0 + fVar199 + auVar97._4_4_
         ) * 0.16666667;
    auVar40._0_4_ =
         (auVar245._0_4_ * fVar141 * 12.0 + auVar245._0_4_ * fVar241 * 6.0 + fVar179 + auVar97._0_4_
         ) * 0.16666667;
    auVar40._8_4_ =
         (auVar245._8_4_ * fVar219 * 12.0 + auVar245._8_4_ * fVar220 * 6.0 + fVar200 + auVar97._8_4_
         ) * 0.16666667;
    auVar40._12_4_ =
         (auVar245._12_4_ * fVar163 * 12.0 + auVar245._12_4_ * fVar178 * 6.0 +
         fVar201 + auVar97._12_4_) * 0.16666667;
    auVar40._16_4_ =
         (auVar245._16_4_ * fVar180 * 12.0 + auVar245._16_4_ * 0.0 * 6.0 + auVar97._16_4_ + 0.0) *
         0.16666667;
    auVar40._20_4_ =
         (auVar245._20_4_ * fVar12 * 12.0 + auVar245._20_4_ * 0.0 * 6.0 + auVar97._20_4_ + 0.0) *
         0.16666667;
    auVar40._24_4_ =
         (auVar245._24_4_ * fVar13 * 12.0 + auVar245._24_4_ * 0.0 * 6.0 + auVar97._24_4_ + 0.0) *
         0.16666667;
    auVar40._28_4_ = auVar250._28_4_;
    auVar41._4_4_ =
         (auVar100._4_4_ + fVar158 +
         auVar245._4_4_ * fVar243 * 12.0 + auVar245._4_4_ * fVar242 * 6.0) * 0.16666667;
    auVar41._0_4_ =
         (auVar100._0_4_ + fVar142 +
         auVar245._0_4_ * fVar241 * 12.0 + auVar245._0_4_ * fVar141 * 6.0) * 0.16666667;
    auVar41._8_4_ =
         (auVar100._8_4_ + fVar159 +
         auVar245._8_4_ * fVar220 * 12.0 + auVar245._8_4_ * fVar219 * 6.0) * 0.16666667;
    auVar41._12_4_ =
         (auVar100._12_4_ + fVar160 +
         auVar245._12_4_ * fVar178 * 12.0 + auVar245._12_4_ * fVar163 * 6.0) * 0.16666667;
    auVar41._16_4_ =
         (auVar100._16_4_ + fVar161 + auVar245._16_4_ * 0.0 * 12.0 + auVar245._16_4_ * fVar180 * 6.0
         ) * 0.16666667;
    auVar41._20_4_ =
         (auVar100._20_4_ + fVar162 + auVar245._20_4_ * 0.0 * 12.0 + auVar245._20_4_ * fVar12 * 6.0)
         * 0.16666667;
    auVar41._24_4_ =
         (auVar100._24_4_ + fVar164 + auVar245._24_4_ * 0.0 * 12.0 + auVar245._24_4_ * fVar13 * 6.0)
         * 0.16666667;
    auVar41._28_4_ = fVar202;
    fVar179 = fVar179 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    fVar200 = fVar200 * 0.16666667;
    fVar201 = fVar201 * 0.16666667;
    auVar42._28_4_ = fVar248 + auVar250._28_4_ + auVar230._28_4_;
    auVar42._0_28_ = ZEXT1628(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar179))));
    auVar100 = vmulps_avx512vl(auVar268._0_32_,auVar42);
    auVar43._4_4_ = (float)local_1e0._4_4_ * fVar199;
    auVar43._0_4_ = (float)local_1e0._0_4_ * fVar179;
    auVar43._8_4_ = fStack_1d8 * fVar200;
    auVar43._12_4_ = fStack_1d4 * fVar201;
    auVar43._16_4_ = fStack_1d0 * 0.0;
    auVar43._20_4_ = fStack_1cc * 0.0;
    auVar43._24_4_ = fStack_1c8 * 0.0;
    auVar43._28_4_ = auVar247._28_4_ + fVar202 + auVar97._28_4_ + 0.0;
    auVar44._4_4_ = local_240._4_4_ * fVar199;
    auVar44._0_4_ = local_240._0_4_ * fVar179;
    auVar44._8_4_ = local_240._8_4_ * fVar200;
    auVar44._12_4_ = local_240._12_4_ * fVar201;
    auVar44._16_4_ = local_240._16_4_ * 0.0;
    auVar44._20_4_ = local_240._20_4_ * 0.0;
    auVar44._24_4_ = local_240._24_4_ * 0.0;
    auVar44._28_4_ = auVar144._0_4_;
    auVar97 = vmulps_avx512vl(local_260,auVar42);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,auVar264._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar265._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar44,auVar41,auVar266._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar267._0_32_,auVar41);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,auVar258._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar40,auVar259._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar40,auVar260._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar262._0_32_,auVar40);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar39,auVar261._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar39,auVar255._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar39,auVar256._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar97,auVar257._0_32_,auVar39);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar101 = vxorps_avx512vl(auVar98,auVar97);
    auVar102 = vxorps_avx512vl(ZEXT1632(auVar86),auVar97);
    auVar223._0_4_ = auVar102._0_4_ * fVar241;
    auVar223._4_4_ = auVar102._4_4_ * fVar243;
    auVar223._8_4_ = auVar102._8_4_ * fVar220;
    auVar223._12_4_ = auVar102._12_4_ * fVar178;
    auVar223._16_4_ = auVar102._16_4_ * 0.0;
    auVar223._20_4_ = auVar102._20_4_ * 0.0;
    auVar223._24_4_ = auVar102._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar106 = vmulps_avx512vl(auVar245._0_32_,auVar99);
    auVar97 = vsubps_avx(auVar223,auVar106);
    auVar45._4_4_ = auVar101._4_4_ * fVar242 * 0.5;
    auVar45._0_4_ = auVar101._0_4_ * fVar141 * 0.5;
    auVar45._8_4_ = auVar101._8_4_ * fVar219 * 0.5;
    auVar45._12_4_ = auVar101._12_4_ * fVar163 * 0.5;
    auVar45._16_4_ = auVar101._16_4_ * fVar180 * 0.5;
    auVar45._20_4_ = auVar101._20_4_ * fVar12 * 0.5;
    auVar45._24_4_ = auVar101._24_4_ * fVar13 * 0.5;
    auVar45._28_4_ = auVar98._28_4_;
    auVar46._4_4_ = auVar97._4_4_ * 0.5;
    auVar46._0_4_ = auVar97._0_4_ * 0.5;
    auVar46._8_4_ = auVar97._8_4_ * 0.5;
    auVar46._12_4_ = auVar97._12_4_ * 0.5;
    auVar46._16_4_ = auVar97._16_4_ * 0.5;
    auVar46._20_4_ = auVar97._20_4_ * 0.5;
    auVar46._24_4_ = auVar97._24_4_ * 0.5;
    auVar46._28_4_ = auVar97._28_4_;
    auVar47._4_4_ = (auVar106._4_4_ + fVar242 * fVar242) * 0.5;
    auVar47._0_4_ = (auVar106._0_4_ + fVar141 * fVar141) * 0.5;
    auVar47._8_4_ = (auVar106._8_4_ + fVar219 * fVar219) * 0.5;
    auVar47._12_4_ = (auVar106._12_4_ + fVar163 * fVar163) * 0.5;
    auVar47._16_4_ = (auVar106._16_4_ + fVar180 * fVar180) * 0.5;
    auVar47._20_4_ = (auVar106._20_4_ + fVar12 * fVar12) * 0.5;
    auVar47._24_4_ = (auVar106._24_4_ + fVar13 * fVar13) * 0.5;
    auVar47._28_4_ = auVar106._28_4_ + auVar236._28_4_;
    fVar141 = fVar241 * fVar241 * 0.5;
    fVar241 = fVar243 * fVar243 * 0.5;
    fVar242 = fVar220 * fVar220 * 0.5;
    fVar243 = fVar178 * fVar178 * 0.5;
    auVar48._28_4_ = auVar240._28_4_;
    auVar48._0_28_ = ZEXT1628(CONCAT412(fVar243,CONCAT48(fVar242,CONCAT44(fVar241,fVar141))));
    auVar49._4_4_ = auVar268._4_4_ * fVar241;
    auVar49._0_4_ = auVar268._0_4_ * fVar141;
    auVar49._8_4_ = auVar268._8_4_ * fVar242;
    auVar49._12_4_ = auVar268._12_4_ * fVar243;
    auVar49._16_4_ = auVar268._16_4_ * 0.0;
    auVar49._20_4_ = auVar268._20_4_ * 0.0;
    auVar49._24_4_ = auVar268._24_4_ * 0.0;
    auVar49._28_4_ = 0x3f000000;
    auVar50._4_4_ = (float)local_1e0._4_4_ * fVar241;
    auVar50._0_4_ = (float)local_1e0._0_4_ * fVar141;
    auVar50._8_4_ = fStack_1d8 * fVar242;
    auVar50._12_4_ = fStack_1d4 * fVar243;
    auVar50._16_4_ = fStack_1d0 * 0.0;
    auVar50._20_4_ = fStack_1cc * 0.0;
    auVar50._24_4_ = fStack_1c8 * 0.0;
    auVar50._28_4_ = auVar102._28_4_;
    auVar51._4_4_ = fVar241 * local_240._4_4_;
    auVar51._0_4_ = fVar141 * local_240._0_4_;
    auVar51._8_4_ = fVar242 * local_240._8_4_;
    auVar51._12_4_ = fVar243 * local_240._12_4_;
    auVar51._16_4_ = local_240._16_4_ * 0.0;
    auVar51._20_4_ = local_240._20_4_ * 0.0;
    auVar51._24_4_ = local_240._24_4_ * 0.0;
    auVar51._28_4_ = uStack_1c4;
    auVar98 = vmulps_avx512vl(local_260,auVar48);
    auVar97 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar264._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar265._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar51,auVar47,auVar266._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar267._0_32_,auVar47);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar46,auVar258._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar46,auVar259._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar46,auVar260._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar262._0_32_,auVar46);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar45,auVar261._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar45,auVar255._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar45,auVar256._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar257._0_32_,auVar45);
    auVar217._4_4_ = fVar14;
    auVar217._0_4_ = fVar14;
    auVar217._8_4_ = fVar14;
    auVar217._12_4_ = fVar14;
    auVar217._16_4_ = fVar14;
    auVar217._20_4_ = fVar14;
    auVar217._24_4_ = fVar14;
    auVar217._28_4_ = fVar14;
    auVar96 = vmulps_avx512vl(auVar217,auVar97);
    auVar52._4_4_ = auVar101._4_4_ * fVar14;
    auVar52._0_4_ = auVar101._0_4_ * fVar14;
    auVar52._8_4_ = auVar101._8_4_ * fVar14;
    auVar52._12_4_ = auVar101._12_4_ * fVar14;
    auVar52._16_4_ = auVar101._16_4_ * fVar14;
    auVar52._20_4_ = auVar101._20_4_ * fVar14;
    auVar52._24_4_ = auVar101._24_4_ * fVar14;
    auVar52._28_4_ = fVar202;
    auVar252 = ZEXT3264(auVar52);
    auVar53._4_4_ = auVar102._4_4_ * fVar14;
    auVar53._0_4_ = auVar102._0_4_ * fVar14;
    auVar53._8_4_ = auVar102._8_4_ * fVar14;
    auVar53._12_4_ = auVar102._12_4_ * fVar14;
    auVar53._16_4_ = auVar102._16_4_ * fVar14;
    auVar53._20_4_ = auVar102._20_4_ * fVar14;
    auVar53._24_4_ = auVar102._24_4_ * fVar14;
    auVar53._28_4_ = auVar102._28_4_;
    fVar202 = auVar98._0_4_ * fVar14;
    fVar141 = auVar98._4_4_ * fVar14;
    auVar54._4_4_ = fVar141;
    auVar54._0_4_ = fVar202;
    fVar241 = auVar98._8_4_ * fVar14;
    auVar54._8_4_ = fVar241;
    fVar242 = auVar98._12_4_ * fVar14;
    auVar54._12_4_ = fVar242;
    fVar243 = auVar98._16_4_ * fVar14;
    auVar54._16_4_ = fVar243;
    fVar219 = auVar98._20_4_ * fVar14;
    auVar54._20_4_ = fVar219;
    fVar220 = auVar98._24_4_ * fVar14;
    auVar54._24_4_ = fVar220;
    auVar54._28_4_ = fVar14;
    auVar86 = vxorps_avx512vl(auVar267._0_16_,auVar267._0_16_);
    auVar107 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,ZEXT1632(auVar86));
    auVar240 = ZEXT3264(auVar107);
    auVar108 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,ZEXT1632(auVar86));
    auVar244 = ZEXT3264(auVar108);
    auVar101 = ZEXT1632(auVar86);
    auVar94 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar101);
    auVar247 = ZEXT3264(auVar94);
    auVar224._0_4_ = fVar202 + auVar100._0_4_;
    auVar224._4_4_ = fVar141 + auVar100._4_4_;
    auVar224._8_4_ = fVar241 + auVar100._8_4_;
    auVar224._12_4_ = fVar242 + auVar100._12_4_;
    auVar224._16_4_ = fVar243 + auVar100._16_4_;
    auVar224._20_4_ = fVar219 + auVar100._20_4_;
    auVar224._24_4_ = fVar220 + auVar100._24_4_;
    auVar224._28_4_ = fVar14 + auVar100._28_4_;
    auVar98 = vmaxps_avx(auVar100,auVar224);
    auVar97 = vminps_avx(auVar100,auVar224);
    auVar95 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar101);
    auVar109 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,auVar101);
    auVar110 = vpermt2ps_avx512vl(auVar52,_DAT_01fb9fc0,auVar101);
    auVar121 = ZEXT1632(auVar86);
    auVar111 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,auVar121);
    auVar100 = vpermt2ps_avx512vl(auVar54,_DAT_01fb9fc0,auVar121);
    auVar100 = vsubps_avx(auVar95,auVar100);
    auVar101 = vsubps_avx(auVar107,auVar103);
    auVar236 = ZEXT3264(auVar101);
    auVar102 = vsubps_avx(auVar108,auVar104);
    auVar106 = vsubps_avx(auVar94,auVar105);
    auVar230 = ZEXT3264(auVar106);
    auVar112 = vmulps_avx512vl(auVar102,auVar53);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar52,auVar106);
    auVar113 = vmulps_avx512vl(auVar106,auVar96);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar53,auVar101);
    auVar114 = vmulps_avx512vl(auVar101,auVar52);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar96,auVar102);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar106,auVar106);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,auVar102);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar101,auVar101);
    auVar114 = vrcp14ps_avx512vl(auVar113);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar115);
    auVar114 = vfmadd132ps_avx512vl(auVar116,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar112,auVar114);
    auVar116 = vmulps_avx512vl(auVar102,auVar111);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar110,auVar106);
    auVar117 = vmulps_avx512vl(auVar106,auVar109);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar101);
    auVar118 = vmulps_avx512vl(auVar101,auVar110);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar109,auVar102);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar112 = vmaxps_avx512vl(auVar112,auVar114);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar114 = vmaxps_avx512vl(auVar100,auVar95);
    auVar98 = vmaxps_avx512vl(auVar98,auVar114);
    auVar114 = vaddps_avx512vl(auVar112,auVar98);
    auVar98 = vminps_avx(auVar100,auVar95);
    auVar98 = vminps_avx(auVar97,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar112);
    auVar26._8_4_ = 0x3f800002;
    auVar26._0_8_ = 0x3f8000023f800002;
    auVar26._12_4_ = 0x3f800002;
    auVar26._16_4_ = 0x3f800002;
    auVar26._20_4_ = 0x3f800002;
    auVar26._24_4_ = 0x3f800002;
    auVar26._28_4_ = 0x3f800002;
    auVar97 = vmulps_avx512vl(auVar114,auVar26);
    auVar27._8_4_ = 0x3f7ffffc;
    auVar27._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar27._12_4_ = 0x3f7ffffc;
    auVar27._16_4_ = 0x3f7ffffc;
    auVar27._20_4_ = 0x3f7ffffc;
    auVar27._24_4_ = 0x3f7ffffc;
    auVar27._28_4_ = 0x3f7ffffc;
    local_920 = vmulps_avx512vl(auVar98,auVar27);
    auVar98 = vmulps_avx512vl(auVar97,auVar97);
    auVar97 = vrsqrt14ps_avx512vl(auVar113);
    auVar28._8_4_ = 0xbf000000;
    auVar28._0_8_ = 0xbf000000bf000000;
    auVar28._12_4_ = 0xbf000000;
    auVar28._16_4_ = 0xbf000000;
    auVar28._20_4_ = 0xbf000000;
    auVar28._24_4_ = 0xbf000000;
    auVar28._28_4_ = 0xbf000000;
    auVar100 = vmulps_avx512vl(auVar113,auVar28);
    fVar202 = auVar97._0_4_;
    fVar141 = auVar97._4_4_;
    fVar241 = auVar97._8_4_;
    fVar242 = auVar97._12_4_;
    fVar243 = auVar97._16_4_;
    fVar219 = auVar97._20_4_;
    fVar220 = auVar97._24_4_;
    auVar55._4_4_ = fVar141 * fVar141 * fVar141 * auVar100._4_4_;
    auVar55._0_4_ = fVar202 * fVar202 * fVar202 * auVar100._0_4_;
    auVar55._8_4_ = fVar241 * fVar241 * fVar241 * auVar100._8_4_;
    auVar55._12_4_ = fVar242 * fVar242 * fVar242 * auVar100._12_4_;
    auVar55._16_4_ = fVar243 * fVar243 * fVar243 * auVar100._16_4_;
    auVar55._20_4_ = fVar219 * fVar219 * fVar219 * auVar100._20_4_;
    auVar55._24_4_ = fVar220 * fVar220 * fVar220 * auVar100._24_4_;
    auVar55._28_4_ = auVar114._28_4_;
    auVar29._8_4_ = 0x3fc00000;
    auVar29._0_8_ = 0x3fc000003fc00000;
    auVar29._12_4_ = 0x3fc00000;
    auVar29._16_4_ = 0x3fc00000;
    auVar29._20_4_ = 0x3fc00000;
    auVar29._24_4_ = 0x3fc00000;
    auVar29._28_4_ = 0x3fc00000;
    auVar97 = vfmadd231ps_avx512vl(auVar55,auVar97,auVar29);
    auVar100 = vmulps_avx512vl(auVar101,auVar97);
    auVar95 = vmulps_avx512vl(auVar102,auVar97);
    auVar112 = vmulps_avx512vl(auVar106,auVar97);
    auVar113 = vsubps_avx512vl(auVar121,auVar103);
    auVar114 = vsubps_avx512vl(auVar121,auVar104);
    auVar116 = vsubps_avx512vl(auVar121,auVar105);
    auVar69._4_4_ = uStack_41c;
    auVar69._0_4_ = local_420;
    auVar69._8_4_ = uStack_418;
    auVar69._12_4_ = uStack_414;
    auVar69._16_4_ = uStack_410;
    auVar69._20_4_ = uStack_40c;
    auVar69._24_4_ = uStack_408;
    auVar69._28_4_ = uStack_404;
    auVar117 = vmulps_avx512vl(auVar69,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar263._0_32_,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_3a0,auVar113);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar114);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,auVar113);
    auVar119 = vmulps_avx512vl(auVar69,auVar112);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar95,auVar263._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar100,local_3a0);
    auVar112 = vmulps_avx512vl(auVar116,auVar112);
    auVar95 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar95);
    auVar100 = vfmadd231ps_avx512vl(auVar95,auVar113,auVar100);
    auVar95 = vmulps_avx512vl(auVar119,auVar119);
    auVar112 = vsubps_avx512vl(local_200,auVar95);
    auVar120 = vmulps_avx512vl(auVar119,auVar100);
    auVar117 = vsubps_avx512vl(auVar117,auVar120);
    auVar117 = vaddps_avx512vl(auVar117,auVar117);
    auVar120 = vmulps_avx512vl(auVar100,auVar100);
    local_600 = vsubps_avx512vl(auVar118,auVar120);
    auVar98 = vsubps_avx512vl(local_600,auVar98);
    local_520 = vmulps_avx512vl(auVar117,auVar117);
    _local_540 = vmulps_avx512vl(auVar112,auVar99);
    auVar99 = vmulps_avx512vl(_local_540,auVar98);
    auVar99 = vsubps_avx512vl(local_520,auVar99);
    uVar82 = vcmpps_avx512vl(auVar99,auVar121,5);
    bVar74 = (byte)uVar82;
    if (bVar74 == 0) {
LAB_01a96ba9:
      auVar263 = ZEXT3264(local_720);
      auVar267 = ZEXT3264(local_7c0);
      auVar266 = ZEXT3264(local_760);
      auVar265 = ZEXT3264(local_740);
      auVar264 = ZEXT3264(local_8e0);
      auVar262 = ZEXT3264(local_8c0);
      auVar261 = ZEXT3264(local_7e0);
      auVar260 = ZEXT3264(local_8a0);
      auVar259 = ZEXT3264(local_880);
      auVar258 = ZEXT3264(local_860);
      auVar257 = ZEXT3264(local_840);
      auVar256 = ZEXT3264(local_820);
      auVar255 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(auVar115);
      auVar268 = ZEXT3264(local_900);
    }
    else {
      auVar99 = vsqrtps_avx512vl(auVar99);
      auVar118 = vaddps_avx512vl(auVar112,auVar112);
      local_6a0 = vrcp14ps_avx512vl(auVar118);
      auVar120 = vfnmadd213ps_avx512vl(local_6a0,auVar118,auVar115);
      auVar120 = vfmadd132ps_avx512vl(auVar120,local_6a0,local_6a0);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      _local_560 = vxorps_avx512vl(auVar117,auVar30);
      auVar121 = vsubps_avx512vl(_local_560,auVar99);
      local_440 = vmulps_avx512vl(auVar121,auVar120);
      auVar99 = vsubps_avx512vl(auVar99,auVar117);
      local_680 = vmulps_avx512vl(auVar99,auVar120);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar99 = vblendmps_avx512vl(auVar99,local_440);
      auVar122._0_4_ =
           (uint)(bVar74 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar120._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * auVar120._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * auVar120._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * auVar120._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * auVar120._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * auVar120._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar81 * auVar99._24_4_ | (uint)!bVar81 * auVar120._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar122._28_4_ = (uint)bVar81 * auVar99._28_4_ | (uint)!bVar81 * auVar120._28_4_;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar99,local_680);
      auVar123._0_4_ =
           (uint)(bVar74 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar99._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar81 * auVar120._4_4_ | (uint)!bVar81 * auVar99._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar81 * auVar120._8_4_ | (uint)!bVar81 * auVar99._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar81 * auVar120._12_4_ | (uint)!bVar81 * auVar99._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar81 * auVar120._16_4_ | (uint)!bVar81 * auVar99._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar81 * auVar120._20_4_ | (uint)!bVar81 * auVar99._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar81 * auVar120._24_4_ | (uint)!bVar81 * auVar99._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar123._28_4_ = (uint)bVar81 * auVar120._28_4_ | (uint)!bVar81 * auVar99._28_4_;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar95,auVar99);
      _local_460 = vmaxps_avx512vl(local_220,auVar99);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_480 = vmulps_avx512vl(_local_460,auVar31);
      vandps_avx512vl(auVar112,auVar99);
      uVar79 = vcmpps_avx512vl(local_480,local_480,1);
      uVar82 = uVar82 & uVar79;
      bVar77 = (byte)uVar82;
      if (bVar77 != 0) {
        uVar79 = vcmpps_avx512vl(auVar98,_DAT_01f7b000,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar95 = vblendmps_avx512vl(auVar98,auVar99);
        bVar78 = (byte)uVar79;
        uVar83 = (uint)(bVar78 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar78 & 1) * local_480._0_4_;
        bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
        uVar134 = (uint)bVar81 * auVar95._4_4_ | (uint)!bVar81 * local_480._4_4_;
        bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
        uVar135 = (uint)bVar81 * auVar95._8_4_ | (uint)!bVar81 * local_480._8_4_;
        bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
        uVar136 = (uint)bVar81 * auVar95._12_4_ | (uint)!bVar81 * local_480._12_4_;
        bVar81 = (bool)((byte)(uVar79 >> 4) & 1);
        uVar137 = (uint)bVar81 * auVar95._16_4_ | (uint)!bVar81 * local_480._16_4_;
        bVar81 = (bool)((byte)(uVar79 >> 5) & 1);
        uVar138 = (uint)bVar81 * auVar95._20_4_ | (uint)!bVar81 * local_480._20_4_;
        bVar81 = (bool)((byte)(uVar79 >> 6) & 1);
        uVar139 = (uint)bVar81 * auVar95._24_4_ | (uint)!bVar81 * local_480._24_4_;
        bVar81 = SUB81(uVar79 >> 7,0);
        uVar140 = (uint)bVar81 * auVar95._28_4_ | (uint)!bVar81 * local_480._28_4_;
        auVar122._0_4_ = (bVar77 & 1) * uVar83 | !(bool)(bVar77 & 1) * auVar122._0_4_;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar122._4_4_ = bVar81 * uVar134 | !bVar81 * auVar122._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar122._8_4_ = bVar81 * uVar135 | !bVar81 * auVar122._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar122._12_4_ = bVar81 * uVar136 | !bVar81 * auVar122._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar122._16_4_ = bVar81 * uVar137 | !bVar81 * auVar122._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar122._20_4_ = bVar81 * uVar138 | !bVar81 * auVar122._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar122._24_4_ = bVar81 * uVar139 | !bVar81 * auVar122._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar122._28_4_ = bVar81 * uVar140 | !bVar81 * auVar122._28_4_;
        auVar98 = vblendmps_avx512vl(auVar99,auVar98);
        bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar79 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar79 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar79 >> 6) & 1);
        bVar11 = SUB81(uVar79 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar78 & 1) * auVar98._0_4_ | !(bool)(bVar78 & 1) * uVar83) |
             !(bool)(bVar77 & 1) * auVar123._0_4_;
        bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar5 * ((uint)bVar81 * auVar98._4_4_ | !bVar81 * uVar134) |
             !bVar5 * auVar123._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar81 * ((uint)bVar6 * auVar98._8_4_ | !bVar6 * uVar135) |
             !bVar81 * auVar123._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar81 * ((uint)bVar7 * auVar98._12_4_ | !bVar7 * uVar136) |
             !bVar81 * auVar123._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar81 * ((uint)bVar8 * auVar98._16_4_ | !bVar8 * uVar137) |
             !bVar81 * auVar123._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar81 * ((uint)bVar9 * auVar98._20_4_ | !bVar9 * uVar138) |
             !bVar81 * auVar123._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar81 * ((uint)bVar10 * auVar98._24_4_ | !bVar10 * uVar139) |
             !bVar81 * auVar123._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar81 * ((uint)bVar11 * auVar98._28_4_ | !bVar11 * uVar140) |
             !bVar81 * auVar123._28_4_;
        bVar74 = (~bVar77 | bVar78) & bVar74;
      }
      auVar70._4_4_ = uStack_41c;
      auVar70._0_4_ = local_420;
      auVar70._8_4_ = uStack_418;
      auVar70._12_4_ = uStack_414;
      auVar70._16_4_ = uStack_410;
      auVar70._20_4_ = uStack_40c;
      auVar70._24_4_ = uStack_408;
      auVar70._28_4_ = uStack_404;
      if ((bVar74 & 0x7f) == 0) {
        auVar115._8_4_ = 0x3f800000;
        auVar115._0_8_ = 0x3f8000003f800000;
        auVar115._12_4_ = 0x3f800000;
        auVar115._16_4_ = 0x3f800000;
        auVar115._20_4_ = 0x3f800000;
        auVar115._24_4_ = 0x3f800000;
        auVar115._28_4_ = 0x3f800000;
        goto LAB_01a96ba9;
      }
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar111 = vxorps_avx512vl(auVar111,auVar95);
      auVar109 = vxorps_avx512vl(auVar109,auVar95);
      auVar110 = vxorps_avx512vl(auVar110,auVar95);
      auVar86 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4f0);
      auVar98 = vbroadcastss_avx512vl(auVar86);
      auVar98 = vmaxps_avx512vl(auVar98,auVar122);
      auVar86 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4f0);
      auVar99 = vbroadcastss_avx512vl(auVar86);
      auVar99 = vminps_avx512vl(auVar99,auVar123);
      auVar112 = vmulps_avx512vl(auVar53,auVar116);
      auVar112 = vfmadd213ps_avx512vl(auVar114,auVar52,auVar112);
      auVar112 = vfmadd213ps_avx512vl(auVar113,auVar96,auVar112);
      auVar113 = vmulps_avx512vl(auVar70,auVar53);
      auVar263 = ZEXT3264(local_720);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_720,auVar52);
      auVar96 = vfmadd231ps_avx512vl(auVar113,local_3a0,auVar96);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar96,auVar113);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar113,auVar114,1);
      auVar112 = vxorps_avx512vl(auVar112,auVar95);
      auVar116 = vrcp14ps_avx512vl(auVar96);
      auVar120 = vxorps_avx512vl(auVar96,auVar95);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar121 = vfnmadd213ps_avx512vl(auVar116,auVar96,auVar115);
      auVar86 = vfmadd132ps_fma(auVar121,auVar116,auVar116);
      fVar202 = auVar86._0_4_ * auVar112._0_4_;
      fVar141 = auVar86._4_4_ * auVar112._4_4_;
      auVar56._4_4_ = fVar141;
      auVar56._0_4_ = fVar202;
      fVar241 = auVar86._8_4_ * auVar112._8_4_;
      auVar56._8_4_ = fVar241;
      fVar242 = auVar86._12_4_ * auVar112._12_4_;
      auVar56._12_4_ = fVar242;
      fVar243 = auVar112._16_4_ * 0.0;
      auVar56._16_4_ = fVar243;
      fVar219 = auVar112._20_4_ * 0.0;
      auVar56._20_4_ = fVar219;
      fVar220 = auVar112._24_4_ * 0.0;
      auVar56._24_4_ = fVar220;
      auVar56._28_4_ = auVar112._28_4_;
      uVar17 = vcmpps_avx512vl(auVar96,auVar120,1);
      bVar77 = (byte)uVar15 | (byte)uVar17;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar56,auVar121);
      auVar125._0_4_ =
           (uint)(bVar77 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar116._0_4_;
      bVar81 = (bool)(bVar77 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar81 * auVar124._4_4_ | (uint)!bVar81 * auVar116._4_4_;
      bVar81 = (bool)(bVar77 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar81 * auVar124._8_4_ | (uint)!bVar81 * auVar116._8_4_;
      bVar81 = (bool)(bVar77 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar81 * auVar124._12_4_ | (uint)!bVar81 * auVar116._12_4_;
      bVar81 = (bool)(bVar77 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar81 * auVar124._16_4_ | (uint)!bVar81 * auVar116._16_4_;
      bVar81 = (bool)(bVar77 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar81 * auVar124._20_4_ | (uint)!bVar81 * auVar116._20_4_;
      bVar81 = (bool)(bVar77 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar81 * auVar124._24_4_ | (uint)!bVar81 * auVar116._24_4_;
      auVar125._28_4_ =
           (uint)(bVar77 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar116._28_4_;
      auVar116 = vmaxps_avx512vl(auVar98,auVar125);
      uVar17 = vcmpps_avx512vl(auVar96,auVar120,6);
      bVar77 = (byte)uVar15 | (byte)uVar17;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126._0_4_ =
           (uint)(bVar77 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar202;
      bVar81 = (bool)(bVar77 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar81 * auVar120._4_4_ | (uint)!bVar81 * (int)fVar141;
      bVar81 = (bool)(bVar77 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar81 * auVar120._8_4_ | (uint)!bVar81 * (int)fVar241;
      bVar81 = (bool)(bVar77 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar81 * auVar120._12_4_ | (uint)!bVar81 * (int)fVar242;
      bVar81 = (bool)(bVar77 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar81 * auVar120._16_4_ | (uint)!bVar81 * (int)fVar243;
      bVar81 = (bool)(bVar77 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar81 * auVar120._20_4_ | (uint)!bVar81 * (int)fVar219;
      bVar81 = (bool)(bVar77 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar81 * auVar120._24_4_ | (uint)!bVar81 * (int)fVar220;
      auVar126._28_4_ =
           (uint)(bVar77 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar112._28_4_;
      auVar112 = vminps_avx512vl(auVar99,auVar126);
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
      auVar99 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
      auVar124 = ZEXT832(0) << 0x20;
      auVar96 = vsubps_avx(auVar124,auVar94);
      auVar96 = vmulps_avx512vl(auVar96,auVar111);
      auVar99 = vfmadd231ps_avx512vl(auVar96,auVar110,auVar99);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar109,auVar98);
      auVar99 = vmulps_avx512vl(auVar70,auVar111);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_720,auVar110);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar109);
      vandps_avx512vl(auVar99,auVar113);
      uVar15 = vcmpps_avx512vl(auVar99,auVar114,1);
      auVar98 = vxorps_avx512vl(auVar98,auVar95);
      auVar96 = vrcp14ps_avx512vl(auVar99);
      auVar107 = vxorps_avx512vl(auVar99,auVar95);
      auVar247 = ZEXT3264(auVar107);
      auVar108 = vfnmadd213ps_avx512vl(auVar96,auVar99,auVar115);
      auVar86 = vfmadd132ps_fma(auVar108,auVar96,auVar96);
      auVar252 = ZEXT1664(auVar86);
      fVar202 = auVar86._0_4_ * auVar98._0_4_;
      fVar141 = auVar86._4_4_ * auVar98._4_4_;
      auVar57._4_4_ = fVar141;
      auVar57._0_4_ = fVar202;
      fVar241 = auVar86._8_4_ * auVar98._8_4_;
      auVar57._8_4_ = fVar241;
      fVar242 = auVar86._12_4_ * auVar98._12_4_;
      auVar57._12_4_ = fVar242;
      fVar243 = auVar98._16_4_ * 0.0;
      auVar57._16_4_ = fVar243;
      fVar219 = auVar98._20_4_ * 0.0;
      auVar57._20_4_ = fVar219;
      fVar220 = auVar98._24_4_ * 0.0;
      auVar57._24_4_ = fVar220;
      auVar57._28_4_ = auVar98._28_4_;
      uVar17 = vcmpps_avx512vl(auVar99,auVar107,1);
      bVar77 = (byte)uVar15 | (byte)uVar17;
      auVar108 = vblendmps_avx512vl(auVar57,auVar121);
      auVar127._0_4_ =
           (uint)(bVar77 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar96._0_4_;
      bVar81 = (bool)(bVar77 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar81 * auVar108._4_4_ | (uint)!bVar81 * auVar96._4_4_;
      bVar81 = (bool)(bVar77 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar81 * auVar108._8_4_ | (uint)!bVar81 * auVar96._8_4_;
      bVar81 = (bool)(bVar77 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar81 * auVar108._12_4_ | (uint)!bVar81 * auVar96._12_4_;
      bVar81 = (bool)(bVar77 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar81 * auVar108._16_4_ | (uint)!bVar81 * auVar96._16_4_;
      bVar81 = (bool)(bVar77 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar81 * auVar108._20_4_ | (uint)!bVar81 * auVar96._20_4_;
      bVar81 = (bool)(bVar77 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar81 * auVar108._24_4_ | (uint)!bVar81 * auVar96._24_4_;
      auVar127._28_4_ =
           (uint)(bVar77 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar96._28_4_;
      local_400 = vmaxps_avx(auVar116,auVar127);
      auVar244 = ZEXT3264(local_400);
      uVar17 = vcmpps_avx512vl(auVar99,auVar107,6);
      bVar77 = (byte)uVar15 | (byte)uVar17;
      auVar128._0_4_ =
           (uint)(bVar77 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar202;
      bVar81 = (bool)(bVar77 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar81 * auVar120._4_4_ | (uint)!bVar81 * (int)fVar141;
      bVar81 = (bool)(bVar77 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar81 * auVar120._8_4_ | (uint)!bVar81 * (int)fVar241;
      bVar81 = (bool)(bVar77 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar81 * auVar120._12_4_ | (uint)!bVar81 * (int)fVar242;
      bVar81 = (bool)(bVar77 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar81 * auVar120._16_4_ | (uint)!bVar81 * (int)fVar243;
      bVar81 = (bool)(bVar77 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar81 * auVar120._20_4_ | (uint)!bVar81 * (int)fVar219;
      bVar81 = (bool)(bVar77 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar81 * auVar120._24_4_ | (uint)!bVar81 * (int)fVar220;
      auVar128._28_4_ =
           (uint)(bVar77 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar98._28_4_;
      local_300 = vminps_avx(auVar112,auVar128);
      auVar240 = ZEXT3264(local_300);
      uVar15 = vcmpps_avx512vl(local_400,local_300,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar15;
      if (bVar74 == 0) goto LAB_01a96ba9;
      auVar98 = vmaxps_avx(auVar124,local_920);
      auVar99 = vfmadd213ps_avx512vl(local_440,auVar119,auVar100);
      fVar202 = auVar97._0_4_;
      fVar141 = auVar97._4_4_;
      auVar58._4_4_ = fVar141 * auVar99._4_4_;
      auVar58._0_4_ = fVar202 * auVar99._0_4_;
      fVar241 = auVar97._8_4_;
      auVar58._8_4_ = fVar241 * auVar99._8_4_;
      fVar242 = auVar97._12_4_;
      auVar58._12_4_ = fVar242 * auVar99._12_4_;
      fVar243 = auVar97._16_4_;
      auVar58._16_4_ = fVar243 * auVar99._16_4_;
      fVar219 = auVar97._20_4_;
      auVar58._20_4_ = fVar219 * auVar99._20_4_;
      fVar220 = auVar97._24_4_;
      auVar58._24_4_ = fVar220 * auVar99._24_4_;
      auVar58._28_4_ = auVar99._28_4_;
      auVar99 = vfmadd213ps_avx512vl(local_680,auVar119,auVar100);
      auVar59._4_4_ = fVar141 * auVar99._4_4_;
      auVar59._0_4_ = fVar202 * auVar99._0_4_;
      auVar59._8_4_ = fVar241 * auVar99._8_4_;
      auVar59._12_4_ = fVar242 * auVar99._12_4_;
      auVar59._16_4_ = fVar243 * auVar99._16_4_;
      auVar59._20_4_ = fVar219 * auVar99._20_4_;
      auVar59._24_4_ = fVar220 * auVar99._24_4_;
      auVar59._28_4_ = auVar99._28_4_;
      auVar99 = vminps_avx512vl(auVar58,auVar115);
      auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar99 = vmaxps_avx(auVar99,ZEXT832(0) << 0x20);
      auVar107 = vminps_avx512vl(auVar59,auVar115);
      auVar60._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar99._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar60,local_700,local_7a0);
      auVar99 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
      auVar61._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar99._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar61,local_700,local_7a0);
      auVar62._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar62._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar62._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar62._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar62._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar62._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar62._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar62._28_4_ = auVar98._28_4_;
      auVar99 = vsubps_avx(local_600,auVar62);
      auVar63._4_4_ = auVar99._4_4_ * (float)local_540._4_4_;
      auVar63._0_4_ = auVar99._0_4_ * (float)local_540._0_4_;
      auVar63._8_4_ = auVar99._8_4_ * fStack_538;
      auVar63._12_4_ = auVar99._12_4_ * fStack_534;
      auVar63._16_4_ = auVar99._16_4_ * fStack_530;
      auVar63._20_4_ = auVar99._20_4_ * fStack_52c;
      auVar63._24_4_ = auVar99._24_4_ * fStack_528;
      auVar63._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_520,auVar63);
      uVar15 = vcmpps_avx512vl(auVar98,ZEXT832(0) << 0x20,5);
      bVar77 = (byte)uVar15;
      auVar265 = ZEXT3264(local_740);
      auVar266 = ZEXT3264(local_760);
      auVar267 = ZEXT3264(local_7c0);
      if (bVar77 == 0) {
        bVar77 = 0;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar250 = ZEXT864(0) << 0x20;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar87 = vxorps_avx512vl(auVar144,auVar144);
        uVar82 = vcmpps_avx512vl(auVar98,auVar124,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar96 = vfnmadd213ps_avx512vl(auVar118,local_6a0,auVar115);
        auVar108 = vfmadd132ps_avx512vl(auVar96,local_6a0,local_6a0);
        auVar96 = vsubps_avx(_local_560,auVar98);
        auVar94 = vmulps_avx512vl(auVar96,auVar108);
        auVar98 = vsubps_avx512vl(auVar98,auVar117);
        auVar95 = vmulps_avx512vl(auVar98,auVar108);
        auVar98 = vfmadd213ps_avx512vl(auVar119,auVar94,auVar100);
        auVar64._4_4_ = fVar141 * auVar98._4_4_;
        auVar64._0_4_ = fVar202 * auVar98._0_4_;
        auVar64._8_4_ = fVar241 * auVar98._8_4_;
        auVar64._12_4_ = fVar242 * auVar98._12_4_;
        auVar64._16_4_ = fVar243 * auVar98._16_4_;
        auVar64._20_4_ = fVar219 * auVar98._20_4_;
        auVar64._24_4_ = fVar220 * auVar98._24_4_;
        auVar64._28_4_ = auVar107._28_4_;
        auVar98 = vmulps_avx512vl(local_3a0,auVar94);
        auVar96 = vmulps_avx512vl(local_720,auVar94);
        auVar71._4_4_ = uStack_41c;
        auVar71._0_4_ = local_420;
        auVar71._8_4_ = uStack_418;
        auVar71._12_4_ = uStack_414;
        auVar71._16_4_ = uStack_410;
        auVar71._20_4_ = uStack_40c;
        auVar71._24_4_ = uStack_408;
        auVar71._28_4_ = uStack_404;
        auVar109 = vmulps_avx512vl(auVar71,auVar94);
        auVar107 = vfmadd213ps_avx512vl(auVar101,auVar64,auVar103);
        auVar107 = vsubps_avx512vl(auVar98,auVar107);
        auVar98 = vfmadd213ps_avx512vl(auVar102,auVar64,auVar104);
        auVar108 = vsubps_avx512vl(auVar96,auVar98);
        auVar86 = vfmadd213ps_fma(auVar64,auVar106,auVar105);
        auVar98 = vsubps_avx(auVar109,ZEXT1632(auVar86));
        auVar244 = ZEXT3264(auVar98);
        auVar98 = vfmadd213ps_avx512vl(auVar119,auVar95,auVar100);
        auVar65._4_4_ = fVar141 * auVar98._4_4_;
        auVar65._0_4_ = fVar202 * auVar98._0_4_;
        auVar65._8_4_ = fVar241 * auVar98._8_4_;
        auVar65._12_4_ = fVar242 * auVar98._12_4_;
        auVar65._16_4_ = fVar243 * auVar98._16_4_;
        auVar65._20_4_ = fVar219 * auVar98._20_4_;
        auVar65._24_4_ = fVar220 * auVar98._24_4_;
        auVar65._28_4_ = auVar97._28_4_;
        auVar98 = vmulps_avx512vl(local_3a0,auVar95);
        auVar97 = vmulps_avx512vl(local_720,auVar95);
        auVar100 = vmulps_avx512vl(auVar71,auVar95);
        auVar86 = vfmadd213ps_fma(auVar101,auVar65,auVar103);
        auVar96 = vsubps_avx(auVar98,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar102,auVar65,auVar104);
        auVar98 = vsubps_avx(auVar97,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar106,auVar65,auVar105);
        auVar97 = vsubps_avx512vl(auVar100,ZEXT1632(auVar86));
        auVar250 = ZEXT3264(auVar97);
        auVar152._8_4_ = 0x7f800000;
        auVar152._0_8_ = 0x7f8000007f800000;
        auVar152._12_4_ = 0x7f800000;
        auVar152._16_4_ = 0x7f800000;
        auVar152._20_4_ = 0x7f800000;
        auVar152._24_4_ = 0x7f800000;
        auVar152._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar152,auVar94);
        bVar81 = (bool)((byte)uVar82 & 1);
        auVar129._0_4_ = (uint)bVar81 * auVar97._0_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar81 * auVar97._4_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar81 * auVar97._8_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar81 * auVar97._12_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar81 * auVar97._16_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar81 * auVar97._20_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar81 * auVar97._24_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar129._28_4_ = (uint)bVar81 * auVar97._28_4_ | (uint)!bVar81 * 0x7f800000;
        auVar194._8_4_ = 0xff800000;
        auVar194._0_8_ = 0xff800000ff800000;
        auVar194._12_4_ = 0xff800000;
        auVar194._16_4_ = 0xff800000;
        auVar194._20_4_ = 0xff800000;
        auVar194._24_4_ = 0xff800000;
        auVar194._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar194,auVar95);
        bVar81 = (bool)((byte)uVar82 & 1);
        auVar130._0_4_ = (uint)bVar81 * auVar97._0_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar81 * auVar97._4_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar81 * auVar97._8_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar81 * auVar97._12_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar81 * auVar97._16_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar81 * auVar97._20_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar81 * auVar97._24_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar130._28_4_ = (uint)bVar81 * auVar97._28_4_ | (uint)!bVar81 * -0x800000;
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(_local_460,auVar32);
        uVar79 = vcmpps_avx512vl(auVar97,local_480,0xe);
        uVar82 = uVar82 & uVar79;
        bVar78 = (byte)uVar82;
        if (bVar78 != 0) {
          uVar79 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar87),2);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar234,auVar249);
          bVar75 = (byte)uVar79;
          uVar83 = (uint)(bVar75 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar97._0_4_;
          bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
          uVar134 = (uint)bVar81 * auVar100._4_4_ | (uint)!bVar81 * auVar97._4_4_;
          bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
          uVar135 = (uint)bVar81 * auVar100._8_4_ | (uint)!bVar81 * auVar97._8_4_;
          bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
          uVar136 = (uint)bVar81 * auVar100._12_4_ | (uint)!bVar81 * auVar97._12_4_;
          bVar81 = (bool)((byte)(uVar79 >> 4) & 1);
          uVar137 = (uint)bVar81 * auVar100._16_4_ | (uint)!bVar81 * auVar97._16_4_;
          bVar81 = (bool)((byte)(uVar79 >> 5) & 1);
          uVar138 = (uint)bVar81 * auVar100._20_4_ | (uint)!bVar81 * auVar97._20_4_;
          bVar81 = (bool)((byte)(uVar79 >> 6) & 1);
          uVar139 = (uint)bVar81 * auVar100._24_4_ | (uint)!bVar81 * auVar97._24_4_;
          bVar81 = SUB81(uVar79 >> 7,0);
          uVar140 = (uint)bVar81 * auVar100._28_4_ | (uint)!bVar81 * auVar97._28_4_;
          auVar129._0_4_ = (bVar78 & 1) * uVar83 | !(bool)(bVar78 & 1) * auVar129._0_4_;
          bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar129._4_4_ = bVar81 * uVar134 | !bVar81 * auVar129._4_4_;
          bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar129._8_4_ = bVar81 * uVar135 | !bVar81 * auVar129._8_4_;
          bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar129._12_4_ = bVar81 * uVar136 | !bVar81 * auVar129._12_4_;
          bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar129._16_4_ = bVar81 * uVar137 | !bVar81 * auVar129._16_4_;
          bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar129._20_4_ = bVar81 * uVar138 | !bVar81 * auVar129._20_4_;
          bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar129._24_4_ = bVar81 * uVar139 | !bVar81 * auVar129._24_4_;
          bVar81 = SUB81(uVar82 >> 7,0);
          auVar129._28_4_ = bVar81 * uVar140 | !bVar81 * auVar129._28_4_;
          auVar97 = vblendmps_avx512vl(auVar249,auVar234);
          bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar79 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar79 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar79 >> 6) & 1);
          bVar11 = SUB81(uVar79 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar78 & 1) *
               ((uint)(bVar75 & 1) * auVar97._0_4_ | !(bool)(bVar75 & 1) * uVar83) |
               !(bool)(bVar78 & 1) * auVar130._0_4_;
          bVar5 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar5 * ((uint)bVar81 * auVar97._4_4_ | !bVar81 * uVar134) |
               !bVar5 * auVar130._4_4_;
          bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar81 * ((uint)bVar6 * auVar97._8_4_ | !bVar6 * uVar135) |
               !bVar81 * auVar130._8_4_;
          bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar81 * ((uint)bVar7 * auVar97._12_4_ | !bVar7 * uVar136) |
               !bVar81 * auVar130._12_4_;
          bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar81 * ((uint)bVar8 * auVar97._16_4_ | !bVar8 * uVar137) |
               !bVar81 * auVar130._16_4_;
          bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar81 * ((uint)bVar9 * auVar97._20_4_ | !bVar9 * uVar138) |
               !bVar81 * auVar130._20_4_;
          bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar81 * ((uint)bVar10 * auVar97._24_4_ | !bVar10 * uVar139) |
               !bVar81 * auVar130._24_4_;
          bVar81 = SUB81(uVar82 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar81 * ((uint)bVar11 * auVar97._28_4_ | !bVar11 * uVar140) |
               !bVar81 * auVar130._28_4_;
          bVar77 = (~bVar78 | bVar75) & bVar77;
        }
      }
      auVar261 = ZEXT3264(local_7e0);
      auVar255 = ZEXT3264(local_800);
      auVar256 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_840);
      auVar258 = ZEXT3264(local_860);
      auVar259 = ZEXT3264(local_880);
      auVar260 = ZEXT3264(local_8a0);
      auVar262 = ZEXT3264(local_8c0);
      auVar264 = ZEXT3264(local_8e0);
      auVar268 = ZEXT3264(local_900);
      uVar143 = *(undefined4 *)&(ray->dir).field_0;
      auVar231._4_4_ = uVar143;
      auVar231._0_4_ = uVar143;
      auVar231._8_4_ = uVar143;
      auVar231._12_4_ = uVar143;
      auVar231._16_4_ = uVar143;
      auVar231._20_4_ = uVar143;
      auVar231._24_4_ = uVar143;
      auVar231._28_4_ = uVar143;
      uVar143 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar235._4_4_ = uVar143;
      auVar235._0_4_ = uVar143;
      auVar235._8_4_ = uVar143;
      auVar235._12_4_ = uVar143;
      auVar235._16_4_ = uVar143;
      auVar235._20_4_ = uVar143;
      auVar235._24_4_ = uVar143;
      auVar235._28_4_ = uVar143;
      auVar236 = ZEXT3264(auVar235);
      fVar202 = (ray->dir).field_0.m128[2];
      auVar252._0_4_ = fVar202 * auVar250._0_4_;
      auVar252._4_4_ = fVar202 * auVar250._4_4_;
      auVar252._8_4_ = fVar202 * auVar250._8_4_;
      auVar252._12_4_ = fVar202 * auVar250._12_4_;
      auVar252._16_4_ = fVar202 * auVar250._16_4_;
      auVar252._20_4_ = fVar202 * auVar250._20_4_;
      auVar252._28_36_ = auVar250._28_36_;
      auVar252._24_4_ = fVar202 * auVar250._24_4_;
      auVar86 = vfmadd231ps_fma(auVar252._0_32_,auVar235,auVar98);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar231,auVar96);
      auVar246._8_4_ = 0x7fffffff;
      auVar246._0_8_ = 0x7fffffff7fffffff;
      auVar246._12_4_ = 0x7fffffff;
      auVar246._16_4_ = 0x7fffffff;
      auVar246._20_4_ = 0x7fffffff;
      auVar246._24_4_ = 0x7fffffff;
      auVar246._28_4_ = 0x7fffffff;
      auVar247 = ZEXT3264(auVar246);
      auVar98 = vandps_avx(auVar246,ZEXT1632(auVar86));
      auVar252 = ZEXT3264(local_400);
      _local_2e0 = local_400;
      auVar229._8_4_ = 0x3e99999a;
      auVar229._0_8_ = 0x3e99999a3e99999a;
      auVar229._12_4_ = 0x3e99999a;
      auVar229._16_4_ = 0x3e99999a;
      auVar229._20_4_ = 0x3e99999a;
      auVar229._24_4_ = 0x3e99999a;
      auVar229._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar98,auVar229,1);
      _local_3c0 = vmaxps_avx(local_400,auVar130);
      auVar230 = ZEXT3264(_local_3c0);
      auVar98 = vminps_avx(local_300,auVar129);
      uVar17 = vcmpps_avx512vl(local_400,auVar98,2);
      bVar78 = (byte)uVar17 & bVar74;
      uVar16 = vcmpps_avx512vl(_local_3c0,local_300,2);
      if ((bVar74 & ((byte)uVar16 | (byte)uVar17)) == 0) {
        auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
      }
      else {
        local_768 = (uint)(byte)((byte)uVar15 | ~bVar77);
        auVar66._4_4_ = auVar244._4_4_ * fVar202;
        auVar66._0_4_ = auVar244._0_4_ * fVar202;
        auVar66._8_4_ = auVar244._8_4_ * fVar202;
        auVar66._12_4_ = auVar244._12_4_ * fVar202;
        auVar66._16_4_ = auVar244._16_4_ * fVar202;
        auVar66._20_4_ = auVar244._20_4_ * fVar202;
        auVar66._24_4_ = auVar244._24_4_ * fVar202;
        auVar66._28_4_ = auVar98._28_4_;
        auVar86 = vfmadd213ps_fma(auVar108,auVar235,auVar66);
        auVar86 = vfmadd213ps_fma(auVar107,auVar231,ZEXT1632(auVar86));
        auVar98 = vandps_avx(auVar246,ZEXT1632(auVar86));
        uVar15 = vcmpps_avx512vl(auVar98,auVar229,1);
        bVar77 = (byte)uVar15 | ~bVar77;
        auVar155._8_4_ = 2;
        auVar155._0_8_ = 0x200000002;
        auVar155._12_4_ = 2;
        auVar155._16_4_ = 2;
        auVar155._20_4_ = 2;
        auVar155._24_4_ = 2;
        auVar155._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar155,auVar33);
        local_2a0._0_4_ = (uint)(bVar77 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
        bVar81 = (bool)(bVar77 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar81 * auVar98._4_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar77 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar81 * auVar98._8_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar77 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar81 * auVar98._12_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar77 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar81 * auVar98._16_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar77 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar81 * auVar98._20_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar77 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar81 * auVar98._24_4_ | (uint)!bVar81 * 2;
        local_2a0._28_4_ = (uint)(bVar77 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
        local_340 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_340,local_2a0,5);
        local_764 = (uint)bVar78;
        local_380 = local_400._0_4_ + (float)local_3e0._0_4_;
        fStack_37c = local_400._4_4_ + (float)local_3e0._4_4_;
        fStack_378 = local_400._8_4_ + fStack_3d8;
        fStack_374 = local_400._12_4_ + fStack_3d4;
        fStack_370 = local_400._16_4_ + fStack_3d0;
        fStack_36c = local_400._20_4_ + fStack_3cc;
        fStack_368 = local_400._24_4_ + fStack_3c8;
        fStack_364 = local_400._28_4_ + fStack_3c4;
        _local_320 = _local_3c0;
        for (bVar78 = (byte)uVar15 & bVar78; auVar98 = local_920, bVar78 != 0;
            bVar78 = ~bVar77 & bVar78 & (byte)uVar15) {
          auVar156._8_4_ = 0x7f800000;
          auVar156._0_8_ = 0x7f8000007f800000;
          auVar156._12_4_ = 0x7f800000;
          auVar156._16_4_ = 0x7f800000;
          auVar156._20_4_ = 0x7f800000;
          auVar156._24_4_ = 0x7f800000;
          auVar156._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar156,local_400);
          auVar132._0_4_ =
               (uint)(bVar78 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 1 & 1);
          auVar132._4_4_ = (uint)bVar81 * auVar97._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 2 & 1);
          auVar132._8_4_ = (uint)bVar81 * auVar97._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 3 & 1);
          auVar132._12_4_ = (uint)bVar81 * auVar97._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 4 & 1);
          auVar132._16_4_ = (uint)bVar81 * auVar97._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 5 & 1);
          auVar132._20_4_ = (uint)bVar81 * auVar97._20_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 6 & 1);
          auVar132._24_4_ = (uint)bVar81 * auVar97._24_4_ | (uint)!bVar81 * 0x7f800000;
          auVar132._28_4_ =
               (uint)(bVar78 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
          auVar97 = vshufps_avx(auVar132,auVar132,0xb1);
          auVar97 = vminps_avx(auVar132,auVar97);
          auVar100 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar100);
          auVar100 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar100);
          uVar15 = vcmpps_avx512vl(auVar132,auVar97,0);
          bVar75 = (byte)uVar15 & bVar78;
          bVar77 = bVar78;
          if (bVar75 != 0) {
            bVar77 = bVar75;
          }
          iVar18 = 0;
          for (uVar83 = (uint)bVar77; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          bVar77 = '\x01' << ((byte)iVar18 & 0x1f);
          auVar236 = ZEXT464(*(uint *)(local_2e0 + (uint)(iVar18 << 2)));
          aVar1 = (ray->dir).field_0;
          local_520._0_16_ = (undefined1  [16])aVar1;
          auVar86 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar86._0_4_ < 0.0) {
            local_920[1] = 0;
            local_920[0] = bVar78;
            local_920._2_30_ = auVar98._2_30_;
            local_7a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
            local_700._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar18 << 2)));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar247 = ZEXT1664(auVar247._0_16_);
            auVar252 = ZEXT1664(auVar252._0_16_);
            fVar202 = sqrtf(auVar86._0_4_);
            auVar236 = ZEXT1664(local_700._0_16_);
            bVar78 = local_920[0];
            auVar268 = ZEXT3264(local_900);
            auVar267 = ZEXT3264(local_7c0);
            auVar266 = ZEXT3264(local_760);
            auVar265 = ZEXT3264(local_740);
            auVar264 = ZEXT3264(local_8e0);
            auVar262 = ZEXT3264(local_8c0);
            auVar260 = ZEXT3264(local_8a0);
            auVar259 = ZEXT3264(local_880);
            auVar258 = ZEXT3264(local_860);
            auVar257 = ZEXT3264(local_840);
            auVar256 = ZEXT3264(local_820);
            auVar255 = ZEXT3264(local_800);
            auVar261 = ZEXT3264(local_7e0);
            auVar263 = ZEXT3264(local_720);
            auVar86 = local_7a0._0_16_;
          }
          else {
            auVar86 = vsqrtss_avx(auVar86,auVar86);
            fVar202 = auVar86._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
          }
          uVar82 = (ulong)bVar77;
          auVar91 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar87 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar230 = ZEXT3264(_local_5e0);
          auVar92 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vminps_avx(auVar91,auVar92);
          auVar91 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar92 = vmaxps_avx(auVar87,auVar91);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar84,auVar203);
          auVar91 = vandps_avx(auVar92,auVar203);
          auVar87 = vmaxps_avx(auVar87,auVar91);
          auVar91 = vmovshdup_avx(auVar87);
          auVar91 = vmaxss_avx(auVar91,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar91);
          local_660 = auVar87._0_4_ * 1.9073486e-06;
          local_4e0 = vshufps_avx(auVar92,auVar92,0xff);
          auVar86 = vinsertps_avx(auVar236._0_16_,auVar86,0x10);
          auVar244 = ZEXT1664(auVar86);
          uVar79 = 0;
          while( true ) {
            bVar75 = (byte)uVar82;
            if (uVar79 == 5) break;
            uVar143 = auVar244._0_4_;
            auVar146._4_4_ = uVar143;
            auVar146._0_4_ = uVar143;
            auVar146._8_4_ = uVar143;
            auVar146._12_4_ = uVar143;
            auVar87 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_520._0_16_);
            _local_540 = auVar244._0_16_;
            auVar86 = vmovshdup_avx(auVar244._0_16_);
            fVar219 = auVar86._0_4_;
            fVar243 = 1.0 - fVar219;
            fVar242 = fVar243 * fVar243 * fVar243;
            fVar141 = fVar219 * fVar219;
            fVar220 = fVar141 * fVar219;
            auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar242),
                                      ZEXT416((uint)fVar220));
            fVar241 = fVar219 * fVar243;
            local_7a0._0_16_ = ZEXT416((uint)fVar243);
            local_920._0_16_ = auVar86;
            auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * fVar219 * 6.0)),
                                      ZEXT416((uint)(fVar241 * fVar243)),
                                      SUB6416(ZEXT464(0x41400000),0));
            auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                      ZEXT416((uint)fVar242));
            auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * fVar243 * 6.0)),
                                      SUB6416(ZEXT464(0x41400000),0),
                                      ZEXT416((uint)(fVar241 * fVar219)));
            fVar242 = fVar242 * 0.16666667;
            fVar243 = (auVar91._0_4_ + auVar92._0_4_) * 0.16666667;
            fVar219 = (auVar86._0_4_ + auVar84._0_4_) * 0.16666667;
            fVar220 = fVar220 * 0.16666667;
            auVar181._0_4_ = fVar220 * (float)local_5e0._0_4_;
            auVar181._4_4_ = fVar220 * (float)local_5e0._4_4_;
            auVar181._8_4_ = fVar220 * fStack_5d8;
            auVar181._12_4_ = fVar220 * fStack_5d4;
            auVar221._4_4_ = fVar219;
            auVar221._0_4_ = fVar219;
            auVar221._8_4_ = fVar219;
            auVar221._12_4_ = fVar219;
            auVar86 = vfmadd132ps_fma(auVar221,auVar181,local_5a0._0_16_);
            auVar182._4_4_ = fVar243;
            auVar182._0_4_ = fVar243;
            auVar182._8_4_ = fVar243;
            auVar182._12_4_ = fVar243;
            auVar86 = vfmadd132ps_fma(auVar182,auVar86,local_5c0._0_16_);
            auVar165._4_4_ = fVar242;
            auVar165._0_4_ = fVar242;
            auVar165._8_4_ = fVar242;
            auVar165._12_4_ = fVar242;
            auVar86 = vfmadd132ps_fma(auVar165,auVar86,local_580._0_16_);
            local_440._0_16_ = auVar86;
            auVar86 = vsubps_avx(auVar87,auVar86);
            local_700._0_16_ = auVar86;
            auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
            local_600._0_16_ = auVar86;
            if (auVar86._0_4_ < 0.0) {
              local_680._0_4_ = fVar141;
              local_6a0._0_4_ = fVar241;
              auVar250._0_4_ = sqrtf(auVar86._0_4_);
              auVar250._4_60_ = extraout_var;
              auVar86 = auVar250._0_16_;
              uVar82 = extraout_RAX;
              fVar241 = (float)local_6a0._0_4_;
            }
            else {
              auVar86 = vsqrtss_avx(auVar86,auVar86);
              local_680._0_4_ = fVar141;
            }
            local_560._4_4_ = local_7a0._0_4_;
            local_560._0_4_ = local_560._4_4_;
            fStack_558 = (float)local_560._4_4_;
            fStack_554 = (float)local_560._4_4_;
            auVar91 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                       ZEXT416((uint)(fVar241 * 4.0)));
            auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * 4.0)),local_7a0._0_16_,
                                      local_7a0._0_16_);
            fVar141 = (float)local_560._4_4_ * -(float)local_560._4_4_ * 0.5;
            fVar241 = auVar91._0_4_ * 0.5;
            fVar242 = auVar87._0_4_ * 0.5;
            local_680._0_4_ = (float)local_680._0_4_ * 0.5;
            auVar204._0_4_ = (float)local_680._0_4_ * (float)local_5e0._0_4_;
            auVar204._4_4_ = (float)local_680._0_4_ * (float)local_5e0._4_4_;
            auVar204._8_4_ = (float)local_680._0_4_ * fStack_5d8;
            auVar204._12_4_ = (float)local_680._0_4_ * fStack_5d4;
            auVar166._4_4_ = fVar242;
            auVar166._0_4_ = fVar242;
            auVar166._8_4_ = fVar242;
            auVar166._12_4_ = fVar242;
            auVar87 = vfmadd132ps_fma(auVar166,auVar204,local_5a0._0_16_);
            auVar183._4_4_ = fVar241;
            auVar183._0_4_ = fVar241;
            auVar183._8_4_ = fVar241;
            auVar183._12_4_ = fVar241;
            auVar87 = vfmadd132ps_fma(auVar183,auVar87,local_5c0._0_16_);
            auVar251._4_4_ = fVar141;
            auVar251._0_4_ = fVar141;
            auVar251._8_4_ = fVar141;
            auVar251._12_4_ = fVar141;
            local_680._0_16_ = vfmadd132ps_fma(auVar251,auVar87,local_580._0_16_);
            _local_460 = vdpps_avx(local_680._0_16_,local_680._0_16_,0x7f);
            auVar67._12_4_ = 0;
            auVar67._0_12_ = ZEXT812(0);
            fVar141 = local_460._0_4_;
            local_650 = vrsqrt14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar141));
            fVar241 = local_650._0_4_;
            local_480._0_16_ = vrcp14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar141));
            auVar87 = vfnmadd213ss_fma(local_480._0_16_,_local_460,ZEXT416(0x40000000));
            local_4a0._0_4_ = auVar87._0_4_;
            local_6a0._0_4_ = auVar86._0_4_;
            if (fVar141 < -fVar141) {
              fVar242 = sqrtf(fVar141);
              auVar86 = ZEXT416((uint)local_6a0._0_4_);
              uVar82 = extraout_RAX_00;
              auVar87 = local_680._0_16_;
            }
            else {
              auVar87 = vsqrtss_avx(_local_460,_local_460);
              fVar242 = auVar87._0_4_;
              auVar87 = local_680._0_16_;
            }
            fVar243 = local_650._0_4_;
            fVar141 = fVar241 * 1.5 + fVar141 * -0.5 * fVar243 * fVar243 * fVar243;
            local_650._0_4_ = auVar87._0_4_ * fVar141;
            local_650._4_4_ = auVar87._4_4_ * fVar141;
            local_650._8_4_ = auVar87._8_4_ * fVar141;
            local_650._12_4_ = auVar87._12_4_ * fVar141;
            auVar91 = vdpps_avx(local_700._0_16_,local_650,0x7f);
            fVar243 = auVar86._0_4_;
            auVar147._0_4_ = auVar91._0_4_ * auVar91._0_4_;
            auVar147._4_4_ = auVar91._4_4_ * auVar91._4_4_;
            auVar147._8_4_ = auVar91._8_4_ * auVar91._8_4_;
            auVar147._12_4_ = auVar91._12_4_ * auVar91._12_4_;
            auVar92 = vsubps_avx(local_600._0_16_,auVar147);
            fVar241 = auVar92._0_4_;
            auVar167._4_12_ = ZEXT812(0) << 0x20;
            auVar167._0_4_ = fVar241;
            auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
            auVar88 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
            if (fVar241 < 0.0) {
              local_4d0._4_4_ = fVar141;
              local_4d0._0_4_ = fVar141;
              fStack_4c8 = fVar141;
              fStack_4c4 = fVar141;
              local_4c0 = auVar84;
              local_4b0 = auVar91;
              fVar219 = sqrtf(fVar241);
              auVar88 = ZEXT416(auVar88._0_4_);
              auVar86 = ZEXT416((uint)local_6a0._0_4_);
              uVar82 = extraout_RAX_01;
              auVar84 = local_4c0;
              auVar87 = local_680._0_16_;
              auVar91 = local_4b0;
              fVar141 = (float)local_4d0._0_4_;
              fVar220 = (float)local_4d0._4_4_;
              fVar163 = fStack_4c8;
              fVar178 = fStack_4c4;
            }
            else {
              auVar92 = vsqrtss_avx(auVar92,auVar92);
              fVar219 = auVar92._0_4_;
              fVar220 = fVar141;
              fVar163 = fVar141;
              fVar178 = fVar141;
            }
            auVar252 = ZEXT1664(auVar87);
            auVar247 = ZEXT1664(local_700._0_16_);
            auVar263 = ZEXT3264(local_720);
            auVar261 = ZEXT3264(local_7e0);
            auVar255 = ZEXT3264(local_800);
            auVar256 = ZEXT3264(local_820);
            auVar257 = ZEXT3264(local_840);
            auVar258 = ZEXT3264(local_860);
            auVar259 = ZEXT3264(local_880);
            auVar260 = ZEXT3264(local_8a0);
            auVar262 = ZEXT3264(local_8c0);
            auVar264 = ZEXT3264(local_8e0);
            auVar265 = ZEXT3264(local_740);
            auVar266 = ZEXT3264(local_760);
            auVar267 = ZEXT3264(local_7c0);
            auVar268 = ZEXT3264(local_900);
            auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                      local_920._0_16_);
            auVar93 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                      local_7a0._0_16_);
            auVar92 = vshufps_avx(_local_540,_local_540,0x55);
            auVar184._0_4_ = auVar92._0_4_ * (float)local_5e0._0_4_;
            auVar184._4_4_ = auVar92._4_4_ * (float)local_5e0._4_4_;
            auVar184._8_4_ = auVar92._8_4_ * fStack_5d8;
            auVar184._12_4_ = auVar92._12_4_ * fStack_5d4;
            auVar205._0_4_ = auVar93._0_4_;
            auVar205._4_4_ = auVar205._0_4_;
            auVar205._8_4_ = auVar205._0_4_;
            auVar205._12_4_ = auVar205._0_4_;
            auVar92 = vfmadd132ps_fma(auVar205,auVar184,local_5a0._0_16_);
            auVar168._0_4_ = auVar85._0_4_;
            auVar168._4_4_ = auVar168._0_4_;
            auVar168._8_4_ = auVar168._0_4_;
            auVar168._12_4_ = auVar168._0_4_;
            auVar92 = vfmadd132ps_fma(auVar168,auVar92,local_5c0._0_16_);
            auVar92 = vfmadd132ps_fma(_local_560,auVar92,local_580._0_16_);
            auVar169._0_4_ = auVar92._0_4_ * (float)local_460._0_4_;
            auVar169._4_4_ = auVar92._4_4_ * (float)local_460._0_4_;
            auVar169._8_4_ = auVar92._8_4_ * (float)local_460._0_4_;
            auVar169._12_4_ = auVar92._12_4_ * (float)local_460._0_4_;
            auVar92 = vdpps_avx(auVar87,auVar92,0x7f);
            fVar180 = auVar92._0_4_;
            auVar185._0_4_ = auVar87._0_4_ * fVar180;
            auVar185._4_4_ = auVar87._4_4_ * fVar180;
            auVar185._8_4_ = auVar87._8_4_ * fVar180;
            auVar185._12_4_ = auVar87._12_4_ * fVar180;
            auVar92 = vsubps_avx(auVar169,auVar185);
            fVar180 = (float)local_4a0._0_4_ * (float)local_480._0_4_;
            auVar85 = vmaxss_avx(ZEXT416((uint)local_660),
                                 ZEXT416((uint)(local_540._0_4_ * fVar202 * 1.9073486e-06)));
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar89 = vxorps_avx512vl(auVar87,auVar20);
            auVar186._0_4_ = fVar141 * auVar92._0_4_ * fVar180;
            auVar186._4_4_ = fVar220 * auVar92._4_4_ * fVar180;
            auVar186._8_4_ = fVar163 * auVar92._8_4_ * fVar180;
            auVar186._12_4_ = fVar178 * auVar92._12_4_ * fVar180;
            auVar92 = vdpps_avx(auVar89,local_650,0x7f);
            auVar93 = vfmadd213ss_fma(auVar86,ZEXT416((uint)local_660),auVar85);
            auVar86 = vdpps_avx(local_700._0_16_,auVar186,0x7f);
            auVar93 = vfmadd213ss_fma(ZEXT416((uint)(fVar243 + 1.0)),
                                      ZEXT416((uint)(local_660 / fVar242)),auVar93);
            fVar141 = auVar92._0_4_ + auVar86._0_4_;
            auVar86 = vdpps_avx(local_520._0_16_,local_650,0x7f);
            auVar92 = vdpps_avx(local_700._0_16_,auVar89,0x7f);
            fVar242 = auVar84._0_4_;
            auVar90 = vaddss_avx512f(auVar88,ZEXT416((uint)(fVar242 * fVar241 * -0.5 *
                                                           fVar242 * fVar242)));
            auVar84 = vdpps_avx(local_700._0_16_,local_520._0_16_,0x7f);
            auVar89 = vfnmadd231ss_fma(auVar92,auVar91,ZEXT416((uint)fVar141));
            auVar84 = vfnmadd231ss_fma(auVar84,auVar91,auVar86);
            auVar92 = vpermilps_avx(local_440._0_16_,0xff);
            fVar219 = fVar219 - auVar92._0_4_;
            auVar88 = vshufps_avx(auVar87,auVar87,0xff);
            auVar92 = vfmsub213ss_fma(auVar89,auVar90,auVar88);
            auVar238._8_4_ = 0x80000000;
            auVar238._0_8_ = 0x8000000080000000;
            auVar238._12_4_ = 0x80000000;
            auVar240 = ZEXT1664(auVar238);
            auVar232._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar232._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar232._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar236 = ZEXT1664(auVar232);
            auVar84 = ZEXT416((uint)(auVar84._0_4_ * auVar90._0_4_));
            auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar92._0_4_)),
                                      ZEXT416((uint)fVar141),auVar84);
            auVar92 = vinsertps_avx(auVar232,auVar84,0x1c);
            auVar227._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar227._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar227._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar84 = vinsertps_avx(ZEXT416((uint)fVar141),auVar227,0x10);
            auVar206._0_4_ = auVar89._0_4_;
            auVar206._4_4_ = auVar206._0_4_;
            auVar206._8_4_ = auVar206._0_4_;
            auVar206._12_4_ = auVar206._0_4_;
            auVar86 = vdivps_avx(auVar92,auVar206);
            auVar92 = vdivps_avx(auVar84,auVar206);
            fVar141 = auVar91._0_4_;
            auVar230 = ZEXT1664(CONCAT412(fVar219,CONCAT48(fVar219,CONCAT44(fVar219,fVar219))));
            auVar207._0_4_ = fVar141 * auVar86._0_4_ + fVar219 * auVar92._0_4_;
            auVar207._4_4_ = fVar141 * auVar86._4_4_ + fVar219 * auVar92._4_4_;
            auVar207._8_4_ = fVar141 * auVar86._8_4_ + fVar219 * auVar92._8_4_;
            auVar207._12_4_ = fVar141 * auVar86._12_4_ + fVar219 * auVar92._12_4_;
            auVar86 = vsubps_avx(_local_540,auVar207);
            auVar244 = ZEXT1664(auVar86);
            auVar21._8_4_ = 0x7fffffff;
            auVar21._0_8_ = 0x7fffffff7fffffff;
            auVar21._12_4_ = 0x7fffffff;
            auVar91 = vandps_avx512vl(auVar91,auVar21);
            if (auVar91._0_4_ < auVar93._0_4_) {
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar93._0_4_ + auVar85._0_4_)),local_4e0,
                                        ZEXT416(0x36000000));
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx512vl(ZEXT416((uint)fVar219),auVar22);
              if (auVar92._0_4_ < auVar91._0_4_) {
                bVar81 = uVar79 < 5;
                fVar202 = auVar86._0_4_ + (float)local_4f0._0_4_;
                bVar75 = 0;
                if ((fVar202 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar202))
                goto LAB_01a97658;
                auVar91 = vmovshdup_avx(auVar86);
                fVar141 = auVar91._0_4_;
                bVar75 = 0;
                if ((fVar141 < 0.0) || (bVar75 = 0, 1.0 < fVar141)) goto LAB_01a97658;
                auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_600._0_4_));
                fVar242 = auVar91._0_4_;
                fVar241 = local_600._0_4_ * -0.5;
                auVar230 = ZEXT464((uint)fVar241);
                pGVar3 = (context->scene->geometries).items[local_928].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar75 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a97658;
                  local_920._0_4_ = ray->tfar;
                  fVar241 = fVar242 * 1.5 + fVar241 * fVar242 * fVar242 * fVar242;
                  auVar208._0_4_ = local_700._0_4_ * fVar241;
                  auVar208._4_4_ = local_700._4_4_ * fVar241;
                  auVar208._8_4_ = local_700._8_4_ * fVar241;
                  auVar208._12_4_ = local_700._12_4_ * fVar241;
                  auVar88 = vfmadd213ps_fma(auVar88,auVar208,auVar87);
                  auVar91 = vshufps_avx(auVar208,auVar208,0xc9);
                  auVar92 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar209._0_4_ = auVar208._0_4_ * auVar92._0_4_;
                  auVar209._4_4_ = auVar208._4_4_ * auVar92._4_4_;
                  auVar209._8_4_ = auVar208._8_4_ * auVar92._8_4_;
                  auVar209._12_4_ = auVar208._12_4_ * auVar92._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar209,auVar87,auVar91);
                  auVar91 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar92 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar230 = ZEXT1664(auVar92);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar148._0_4_ = auVar88._0_4_ * auVar84._0_4_;
                  auVar148._4_4_ = auVar88._4_4_ * auVar84._4_4_;
                  auVar148._8_4_ = auVar88._8_4_ * auVar84._8_4_;
                  auVar148._12_4_ = auVar88._12_4_ * auVar84._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar148,auVar91,auVar92);
                  auVar91 = vshufps_avx(auVar84,auVar84,0xe9);
                  local_640 = vmovlps_avx(auVar91);
                  local_638 = auVar84._0_4_;
                  local_630 = 0;
                  local_62c = (undefined4)local_930;
                  local_628 = (undefined4)local_928;
                  local_624 = context->user->instID[0];
                  local_620 = context->user->instPrimID[0];
                  ray->tfar = fVar202;
                  local_934 = -1;
                  local_6d0.valid = &local_934;
                  local_6d0.geometryUserPtr = pGVar3->userPtr;
                  local_6d0.context = context->user;
                  local_6d0.hit = (RTCHitN *)&local_640;
                  local_6d0.N = 1;
                  local_7a0._0_8_ = pGVar3;
                  local_6d0.ray = (RTCRayN *)ray;
                  local_634 = fVar141;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a978c7:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar230 = ZEXT1664(auVar230._0_16_);
                      auVar236 = ZEXT1664(auVar236._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      (*p_Var4)(&local_6d0);
                      auVar268 = ZEXT3264(local_900);
                      auVar267 = ZEXT3264(local_7c0);
                      auVar266 = ZEXT3264(local_760);
                      auVar265 = ZEXT3264(local_740);
                      auVar264 = ZEXT3264(local_8e0);
                      auVar262 = ZEXT3264(local_8c0);
                      auVar260 = ZEXT3264(local_8a0);
                      auVar259 = ZEXT3264(local_880);
                      auVar258 = ZEXT3264(local_860);
                      auVar257 = ZEXT3264(local_840);
                      auVar256 = ZEXT3264(local_820);
                      auVar255 = ZEXT3264(local_800);
                      auVar261 = ZEXT3264(local_7e0);
                      auVar263 = ZEXT3264(local_720);
                      if (*local_6d0.valid == 0) goto LAB_01a97985;
                    }
                    bVar75 = 1;
                    goto LAB_01a97658;
                  }
                  auVar230 = ZEXT1664(auVar92);
                  auVar236 = ZEXT1664(auVar232);
                  auVar240 = ZEXT1664(auVar238);
                  auVar244 = ZEXT1664(auVar86);
                  auVar247 = ZEXT1664(local_700._0_16_);
                  auVar252 = ZEXT1664(auVar87);
                  (*pGVar3->occlusionFilterN)(&local_6d0);
                  auVar268 = ZEXT3264(local_900);
                  auVar267 = ZEXT3264(local_7c0);
                  auVar266 = ZEXT3264(local_760);
                  auVar265 = ZEXT3264(local_740);
                  auVar264 = ZEXT3264(local_8e0);
                  auVar262 = ZEXT3264(local_8c0);
                  auVar260 = ZEXT3264(local_8a0);
                  auVar259 = ZEXT3264(local_880);
                  auVar258 = ZEXT3264(local_860);
                  auVar257 = ZEXT3264(local_840);
                  auVar256 = ZEXT3264(local_820);
                  auVar255 = ZEXT3264(local_800);
                  auVar261 = ZEXT3264(local_7e0);
                  auVar263 = ZEXT3264(local_720);
                  if (*local_6d0.valid != 0) goto LAB_01a978c7;
LAB_01a97985:
                  ray->tfar = (float)local_920._0_4_;
                }
                bVar75 = 0;
                goto LAB_01a97658;
              }
            }
            uVar79 = uVar79 + 1;
          }
          bVar81 = false;
LAB_01a97658:
          bVar80 = bVar80 | bVar81 & bVar75;
          auVar72._4_4_ = fStack_37c;
          auVar72._0_4_ = local_380;
          auVar72._8_4_ = fStack_378;
          auVar72._12_4_ = fStack_374;
          auVar72._16_4_ = fStack_370;
          auVar72._20_4_ = fStack_36c;
          auVar72._24_4_ = fStack_368;
          auVar72._28_4_ = fStack_364;
          fVar202 = ray->tfar;
          auVar34._4_4_ = fVar202;
          auVar34._0_4_ = fVar202;
          auVar34._8_4_ = fVar202;
          auVar34._12_4_ = fVar202;
          auVar34._16_4_ = fVar202;
          auVar34._20_4_ = fVar202;
          auVar34._24_4_ = fVar202;
          auVar34._28_4_ = fVar202;
          uVar15 = vcmpps_avx512vl(auVar72,auVar34,2);
        }
        auVar176._0_4_ = (float)local_3e0._0_4_ + (float)local_3c0._0_4_;
        auVar176._4_4_ = (float)local_3e0._4_4_ + (float)local_3c0._4_4_;
        auVar176._8_4_ = fStack_3d8 + fStack_3b8;
        auVar176._12_4_ = fStack_3d4 + fStack_3b4;
        auVar176._16_4_ = fStack_3d0 + fStack_3b0;
        auVar176._20_4_ = fStack_3cc + fStack_3ac;
        auVar176._24_4_ = fStack_3c8 + fStack_3a8;
        auVar176._28_4_ = fStack_3c4 + fStack_3a4;
        fVar141 = ray->tfar;
        fVar202 = ray->tfar;
        auVar35._4_4_ = fVar202;
        auVar35._0_4_ = fVar202;
        auVar35._8_4_ = fVar202;
        auVar35._12_4_ = fVar202;
        auVar35._16_4_ = fVar202;
        auVar35._20_4_ = fVar202;
        auVar35._24_4_ = fVar202;
        auVar35._28_4_ = fVar202;
        uVar15 = vcmpps_avx512vl(auVar176,auVar35,2);
        auVar177._8_4_ = 2;
        auVar177._0_8_ = 0x200000002;
        auVar177._12_4_ = 2;
        auVar177._16_4_ = 2;
        auVar177._20_4_ = 2;
        auVar177._24_4_ = 2;
        auVar177._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar177,auVar36);
        bVar81 = (bool)((byte)local_768 & 1);
        local_3c0._0_4_ = (uint)bVar81 * auVar98._0_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)((byte)(local_768 >> 1) & 1);
        local_3c0._4_4_ = (uint)bVar81 * auVar98._4_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)((byte)(local_768 >> 2) & 1);
        fStack_3b8 = (float)((uint)bVar81 * auVar98._8_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_768 >> 3) & 1);
        fStack_3b4 = (float)((uint)bVar81 * auVar98._12_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_768 >> 4) & 1);
        fStack_3b0 = (float)((uint)bVar81 * auVar98._16_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_768 >> 5) & 1);
        fStack_3ac = (float)((uint)bVar81 * auVar98._20_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_768 >> 6) & 1);
        fStack_3a8 = (float)((uint)bVar81 * auVar98._24_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_768 >> 7) & 1);
        fStack_3a4 = (float)((uint)bVar81 * auVar98._28_4_ | (uint)!bVar81 * 2);
        bVar74 = (byte)uVar16 & bVar74 & (byte)uVar15;
        uVar15 = vpcmpd_avx512vl(_local_3c0,local_340,2);
        local_400 = _local_320;
        local_380 = (float)local_3e0._0_4_ + (float)local_320._0_4_;
        fStack_37c = (float)local_3e0._4_4_ + (float)local_320._4_4_;
        fStack_378 = fStack_3d8 + fStack_318;
        fStack_374 = fStack_3d4 + fStack_314;
        fStack_370 = fStack_3d0 + fStack_310;
        fStack_36c = fStack_3cc + fStack_30c;
        fStack_368 = fStack_3c8 + fStack_308;
        fStack_364 = fStack_3c4 + fStack_304;
        auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        for (bVar77 = (byte)uVar15 & bVar74; auVar98 = local_920, bVar77 != 0;
            bVar77 = ~bVar78 & bVar77 & (byte)uVar15) {
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar157,local_400);
          auVar133._0_4_ =
               (uint)(bVar77 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar81 * auVar97._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar81 * auVar97._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar81 * auVar97._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar81 * auVar97._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar81 * auVar97._20_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 6 & 1);
          auVar133._24_4_ = (uint)bVar81 * auVar97._24_4_ | (uint)!bVar81 * 0x7f800000;
          auVar133._28_4_ =
               (uint)(bVar77 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar77 >> 7) * 0x7f800000;
          auVar97 = vshufps_avx(auVar133,auVar133,0xb1);
          auVar97 = vminps_avx(auVar133,auVar97);
          auVar100 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar100);
          auVar100 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar100);
          uVar15 = vcmpps_avx512vl(auVar133,auVar97,0);
          bVar75 = (byte)uVar15 & bVar77;
          bVar78 = bVar77;
          if (bVar75 != 0) {
            bVar78 = bVar75;
          }
          iVar18 = 0;
          for (uVar83 = (uint)bVar78; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          bVar78 = '\x01' << ((byte)iVar18 & 0x1f);
          auVar236 = ZEXT464(*(uint *)(local_300 + (uint)(iVar18 << 2)));
          aVar1 = (ray->dir).field_0;
          local_520._0_16_ = (undefined1  [16])aVar1;
          auVar86 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar86._0_4_ < 0.0) {
            local_920[1] = 0;
            local_920[0] = bVar77;
            local_920._2_30_ = auVar98._2_30_;
            local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
            local_700._0_16_ = ZEXT416(*(uint *)(local_300 + (uint)(iVar18 << 2)));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar247 = ZEXT1664(auVar247._0_16_);
            auVar252 = ZEXT1664(auVar252._0_16_);
            fVar202 = sqrtf(auVar86._0_4_);
            auVar236 = ZEXT1664(local_700._0_16_);
            bVar77 = local_920[0];
            auVar268 = ZEXT3264(local_900);
            auVar267 = ZEXT3264(local_7c0);
            auVar266 = ZEXT3264(local_760);
            auVar265 = ZEXT3264(local_740);
            auVar264 = ZEXT3264(local_8e0);
            auVar262 = ZEXT3264(local_8c0);
            auVar260 = ZEXT3264(local_8a0);
            auVar259 = ZEXT3264(local_880);
            auVar258 = ZEXT3264(local_860);
            auVar257 = ZEXT3264(local_840);
            auVar256 = ZEXT3264(local_820);
            auVar255 = ZEXT3264(local_800);
            auVar261 = ZEXT3264(local_7e0);
            auVar263 = ZEXT3264(local_720);
            auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar86 = local_7a0._0_16_;
          }
          else {
            auVar86 = vsqrtss_avx(auVar86,auVar86);
            fVar202 = auVar86._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
          }
          uVar82 = (ulong)bVar78;
          auVar91 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar87 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar230 = ZEXT3264(_local_5e0);
          auVar92 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vminps_avx(auVar91,auVar92);
          auVar91 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar92 = vmaxps_avx(auVar87,auVar91);
          auVar210._8_4_ = 0x7fffffff;
          auVar210._0_8_ = 0x7fffffff7fffffff;
          auVar210._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar84,auVar210);
          auVar91 = vandps_avx(auVar92,auVar210);
          auVar87 = vmaxps_avx(auVar87,auVar91);
          auVar91 = vmovshdup_avx(auVar87);
          auVar91 = vmaxss_avx(auVar91,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar91);
          fVar141 = auVar87._0_4_ * 1.9073486e-06;
          local_4e0 = vshufps_avx(auVar92,auVar92,0xff);
          auVar86 = vinsertps_avx(auVar236._0_16_,auVar86,0x10);
          auVar244 = ZEXT1664(auVar86);
          uVar79 = 0;
          while( true ) {
            bVar75 = (byte)uVar82;
            if (uVar79 == 5) break;
            uVar143 = auVar244._0_4_;
            auVar149._4_4_ = uVar143;
            auVar149._0_4_ = uVar143;
            auVar149._8_4_ = uVar143;
            auVar149._12_4_ = uVar143;
            auVar87 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_520._0_16_);
            _local_540 = auVar244._0_16_;
            auVar86 = vmovshdup_avx(auVar244._0_16_);
            fVar220 = auVar86._0_4_;
            fVar219 = 1.0 - fVar220;
            fVar243 = fVar219 * fVar219 * fVar219;
            fVar241 = fVar220 * fVar220;
            fVar163 = fVar241 * fVar220;
            auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                      ZEXT416((uint)fVar163));
            fVar242 = fVar220 * fVar219;
            local_7a0._0_16_ = ZEXT416((uint)fVar219);
            local_920._0_16_ = auVar86;
            auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar220 * 6.0)),
                                      ZEXT416((uint)(fVar242 * fVar219)),
                                      SUB6416(ZEXT464(0x41400000),0));
            auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar163),
                                      ZEXT416((uint)fVar243));
            auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar219 * 6.0)),
                                      SUB6416(ZEXT464(0x41400000),0),
                                      ZEXT416((uint)(fVar242 * fVar220)));
            fVar243 = fVar243 * 0.16666667;
            fVar219 = (auVar91._0_4_ + auVar92._0_4_) * 0.16666667;
            fVar220 = (auVar86._0_4_ + auVar84._0_4_) * 0.16666667;
            fVar163 = fVar163 * 0.16666667;
            auVar187._0_4_ = fVar163 * (float)local_5e0._0_4_;
            auVar187._4_4_ = fVar163 * (float)local_5e0._4_4_;
            auVar187._8_4_ = fVar163 * fStack_5d8;
            auVar187._12_4_ = fVar163 * fStack_5d4;
            auVar222._4_4_ = fVar220;
            auVar222._0_4_ = fVar220;
            auVar222._8_4_ = fVar220;
            auVar222._12_4_ = fVar220;
            auVar86 = vfmadd132ps_fma(auVar222,auVar187,local_5a0._0_16_);
            auVar188._4_4_ = fVar219;
            auVar188._0_4_ = fVar219;
            auVar188._8_4_ = fVar219;
            auVar188._12_4_ = fVar219;
            auVar86 = vfmadd132ps_fma(auVar188,auVar86,local_5c0._0_16_);
            auVar170._4_4_ = fVar243;
            auVar170._0_4_ = fVar243;
            auVar170._8_4_ = fVar243;
            auVar170._12_4_ = fVar243;
            auVar86 = vfmadd132ps_fma(auVar170,auVar86,local_580._0_16_);
            local_440._0_16_ = auVar86;
            auVar86 = vsubps_avx(auVar87,auVar86);
            local_700._0_16_ = auVar86;
            auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
            local_600._0_16_ = auVar86;
            if (auVar86._0_4_ < 0.0) {
              local_680._0_4_ = fVar241;
              local_6a0._0_4_ = fVar242;
              auVar230._0_4_ = sqrtf(auVar86._0_4_);
              auVar230._4_60_ = extraout_var_00;
              auVar86 = auVar230._0_16_;
              uVar82 = extraout_RAX_02;
              fVar242 = (float)local_6a0._0_4_;
            }
            else {
              auVar86 = vsqrtss_avx(auVar86,auVar86);
              local_680._0_4_ = fVar241;
            }
            local_460._4_4_ = local_7a0._0_4_;
            local_460._0_4_ = local_460._4_4_;
            fStack_458 = (float)local_460._4_4_;
            fStack_454 = (float)local_460._4_4_;
            auVar91 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                       ZEXT416((uint)(fVar242 * 4.0)));
            auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * 4.0)),local_7a0._0_16_,
                                      local_7a0._0_16_);
            fVar241 = (float)local_460._4_4_ * -(float)local_460._4_4_ * 0.5;
            fVar242 = auVar91._0_4_ * 0.5;
            fVar243 = auVar87._0_4_ * 0.5;
            local_680._0_4_ = (float)local_680._0_4_ * 0.5;
            auVar211._0_4_ = (float)local_680._0_4_ * (float)local_5e0._0_4_;
            auVar211._4_4_ = (float)local_680._0_4_ * (float)local_5e0._4_4_;
            auVar211._8_4_ = (float)local_680._0_4_ * fStack_5d8;
            auVar211._12_4_ = (float)local_680._0_4_ * fStack_5d4;
            auVar171._4_4_ = fVar243;
            auVar171._0_4_ = fVar243;
            auVar171._8_4_ = fVar243;
            auVar171._12_4_ = fVar243;
            auVar87 = vfmadd132ps_fma(auVar171,auVar211,local_5a0._0_16_);
            auVar189._4_4_ = fVar242;
            auVar189._0_4_ = fVar242;
            auVar189._8_4_ = fVar242;
            auVar189._12_4_ = fVar242;
            auVar87 = vfmadd132ps_fma(auVar189,auVar87,local_5c0._0_16_);
            auVar253._4_4_ = fVar241;
            auVar253._0_4_ = fVar241;
            auVar253._8_4_ = fVar241;
            auVar253._12_4_ = fVar241;
            local_680._0_16_ = vfmadd132ps_fma(auVar253,auVar87,local_580._0_16_);
            local_480._0_16_ = vdpps_avx(local_680._0_16_,local_680._0_16_,0x7f);
            auVar68._12_4_ = 0;
            auVar68._0_12_ = ZEXT812(0);
            fVar241 = local_480._0_4_;
            _local_560 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar241));
            fVar242 = local_560._0_4_;
            local_660 = fVar241 * -0.5;
            local_4a0 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar241));
            auVar87 = vfnmadd213ss_fma(local_4a0,local_480._0_16_,ZEXT416(0x40000000));
            local_650._0_4_ = auVar87._0_4_;
            local_6a0._0_4_ = auVar86._0_4_;
            if (fVar241 < -fVar241) {
              fVar241 = sqrtf(fVar241);
              auVar86 = ZEXT416((uint)local_6a0._0_4_);
              uVar82 = extraout_RAX_03;
              auVar87 = local_680._0_16_;
            }
            else {
              auVar87 = vsqrtss_avx(local_480._0_16_,local_480._0_16_);
              fVar241 = auVar87._0_4_;
              auVar87 = local_680._0_16_;
            }
            fVar243 = local_560._0_4_;
            local_660 = fVar242 * 1.5 + local_660 * fVar243 * fVar243 * fVar243;
            auVar254._0_4_ = auVar87._0_4_ * local_660;
            auVar254._4_4_ = auVar87._4_4_ * local_660;
            auVar254._8_4_ = auVar87._8_4_ * local_660;
            auVar254._12_4_ = auVar87._12_4_ * local_660;
            _local_560 = vdpps_avx(local_700._0_16_,auVar254,0x7f);
            fVar242 = auVar86._0_4_ + 1.0;
            auVar150._0_4_ = local_560._0_4_ * local_560._0_4_;
            auVar150._4_4_ = local_560._4_4_ * local_560._4_4_;
            auVar150._8_4_ = local_560._8_4_ * local_560._8_4_;
            auVar150._12_4_ = local_560._12_4_ * local_560._12_4_;
            auVar91 = vsubps_avx(local_600._0_16_,auVar150);
            fVar243 = auVar91._0_4_;
            auVar172._4_12_ = ZEXT812(0) << 0x20;
            auVar172._0_4_ = fVar243;
            auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
            auVar84 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
            fStack_65c = local_660;
            fStack_658 = local_660;
            fStack_654 = local_660;
            if (fVar243 < 0.0) {
              local_4b0._0_4_ = fVar242;
              _local_4d0 = auVar254;
              local_4c0 = auVar92;
              fVar219 = sqrtf(fVar243);
              auVar84 = ZEXT416(auVar84._0_4_);
              auVar86 = ZEXT416((uint)local_6a0._0_4_);
              uVar82 = extraout_RAX_04;
              auVar92 = local_4c0;
              auVar87 = local_680._0_16_;
              fVar242 = (float)local_4b0._0_4_;
              auVar254 = _local_4d0;
            }
            else {
              auVar91 = vsqrtss_avx(auVar91,auVar91);
              fVar219 = auVar91._0_4_;
            }
            auVar252 = ZEXT1664(local_600._0_16_);
            auVar247 = ZEXT1664(local_700._0_16_);
            auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar263 = ZEXT3264(local_720);
            auVar261 = ZEXT3264(local_7e0);
            auVar255 = ZEXT3264(local_800);
            auVar256 = ZEXT3264(local_820);
            auVar257 = ZEXT3264(local_840);
            auVar258 = ZEXT3264(local_860);
            auVar259 = ZEXT3264(local_880);
            auVar260 = ZEXT3264(local_8a0);
            auVar262 = ZEXT3264(local_8c0);
            auVar264 = ZEXT3264(local_8e0);
            auVar265 = ZEXT3264(local_740);
            auVar266 = ZEXT3264(local_760);
            auVar267 = ZEXT3264(local_7c0);
            auVar268 = ZEXT3264(local_900);
            auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                      local_920._0_16_);
            auVar85 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                      local_7a0._0_16_);
            auVar91 = vshufps_avx(_local_540,_local_540,0x55);
            auVar190._0_4_ = auVar91._0_4_ * (float)local_5e0._0_4_;
            auVar190._4_4_ = auVar91._4_4_ * (float)local_5e0._4_4_;
            auVar190._8_4_ = auVar91._8_4_ * fStack_5d8;
            auVar190._12_4_ = auVar91._12_4_ * fStack_5d4;
            auVar212._0_4_ = auVar85._0_4_;
            auVar212._4_4_ = auVar212._0_4_;
            auVar212._8_4_ = auVar212._0_4_;
            auVar212._12_4_ = auVar212._0_4_;
            auVar91 = vfmadd132ps_fma(auVar212,auVar190,local_5a0._0_16_);
            auVar173._0_4_ = auVar88._0_4_;
            auVar173._4_4_ = auVar173._0_4_;
            auVar173._8_4_ = auVar173._0_4_;
            auVar173._12_4_ = auVar173._0_4_;
            auVar91 = vfmadd132ps_fma(auVar173,auVar91,local_5c0._0_16_);
            auVar91 = vfmadd132ps_fma(_local_460,auVar91,local_580._0_16_);
            auVar174._0_4_ = auVar91._0_4_ * (float)local_480._0_4_;
            auVar174._4_4_ = auVar91._4_4_ * (float)local_480._0_4_;
            auVar174._8_4_ = auVar91._8_4_ * (float)local_480._0_4_;
            auVar174._12_4_ = auVar91._12_4_ * (float)local_480._0_4_;
            auVar91 = vdpps_avx(auVar87,auVar91,0x7f);
            fVar220 = auVar91._0_4_;
            auVar191._0_4_ = auVar87._0_4_ * fVar220;
            auVar191._4_4_ = auVar87._4_4_ * fVar220;
            auVar191._8_4_ = auVar87._8_4_ * fVar220;
            auVar191._12_4_ = auVar87._12_4_ * fVar220;
            auVar91 = vsubps_avx(auVar174,auVar191);
            fVar220 = (float)local_650._0_4_ * (float)local_4a0._0_4_;
            auVar88 = vmaxss_avx(ZEXT416((uint)fVar141),
                                 ZEXT416((uint)(local_540._0_4_ * fVar202 * 1.9073486e-06)));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar87,auVar23);
            auVar192._0_4_ = auVar91._0_4_ * fVar220 * local_660;
            auVar192._4_4_ = auVar91._4_4_ * fVar220 * fStack_65c;
            auVar192._8_4_ = auVar91._8_4_ * fVar220 * fStack_658;
            auVar192._12_4_ = auVar91._12_4_ * fVar220 * fStack_654;
            auVar91 = vdpps_avx(auVar93,auVar254,0x7f);
            auVar85 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar141),auVar88);
            auVar86 = vdpps_avx(local_700._0_16_,auVar192,0x7f);
            auVar85 = vfmadd213ss_fma(ZEXT416((uint)fVar242),ZEXT416((uint)(fVar141 / fVar241)),
                                      auVar85);
            fVar241 = auVar91._0_4_ + auVar86._0_4_;
            auVar86 = vdpps_avx(local_520._0_16_,auVar254,0x7f);
            auVar91 = vdpps_avx(local_700._0_16_,auVar93,0x7f);
            fVar242 = auVar92._0_4_;
            auVar93 = vaddss_avx512f(auVar84,ZEXT416((uint)(fVar242 * fVar243 * -0.5 *
                                                           fVar242 * fVar242)));
            auVar92 = vdpps_avx(local_700._0_16_,local_520._0_16_,0x7f);
            auVar89 = vfnmadd231ss_avx512f(auVar91,_local_560,ZEXT416((uint)fVar241));
            auVar92 = vfnmadd231ss_avx512f(auVar92,_local_560,auVar86);
            auVar91 = vpermilps_avx(local_440._0_16_,0xff);
            fVar219 = fVar219 - auVar91._0_4_;
            auVar84 = vshufps_avx(auVar87,auVar87,0xff);
            auVar91 = vfmsub213ss_fma(auVar89,auVar93,auVar84);
            auVar239._8_4_ = 0x80000000;
            auVar239._0_8_ = 0x8000000080000000;
            auVar239._12_4_ = 0x80000000;
            auVar240 = ZEXT1664(auVar239);
            auVar233._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
            auVar233._8_4_ = auVar91._8_4_ ^ 0x80000000;
            auVar233._12_4_ = auVar91._12_4_ ^ 0x80000000;
            auVar236 = ZEXT1664(auVar233);
            auVar92 = ZEXT416((uint)(auVar92._0_4_ * auVar93._0_4_));
            auVar93 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar91._0_4_)),
                                      ZEXT416((uint)fVar241),auVar92);
            auVar91 = vinsertps_avx(auVar233,auVar92,0x1c);
            auVar228._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar228._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar228._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar92 = vinsertps_avx(ZEXT416((uint)fVar241),auVar228,0x10);
            auVar213._0_4_ = auVar93._0_4_;
            auVar213._4_4_ = auVar213._0_4_;
            auVar213._8_4_ = auVar213._0_4_;
            auVar213._12_4_ = auVar213._0_4_;
            auVar86 = vdivps_avx(auVar91,auVar213);
            auVar91 = vdivps_avx(auVar92,auVar213);
            auVar92 = vbroadcastss_avx512vl(_local_560);
            auVar230 = ZEXT1664(CONCAT412(fVar219,CONCAT48(fVar219,CONCAT44(fVar219,fVar219))));
            auVar214._0_4_ = auVar92._0_4_ * auVar86._0_4_ + fVar219 * auVar91._0_4_;
            auVar214._4_4_ = auVar92._4_4_ * auVar86._4_4_ + fVar219 * auVar91._4_4_;
            auVar214._8_4_ = auVar92._8_4_ * auVar86._8_4_ + fVar219 * auVar91._8_4_;
            auVar214._12_4_ = auVar92._12_4_ * auVar86._12_4_ + fVar219 * auVar91._12_4_;
            auVar86 = vsubps_avx(_local_540,auVar214);
            auVar244 = ZEXT1664(auVar86);
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar91 = vandps_avx512vl(_local_560,auVar24);
            if (auVar91._0_4_ < auVar85._0_4_) {
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ + auVar88._0_4_)),local_4e0,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx512vl(ZEXT416((uint)fVar219),auVar25);
              if (auVar92._0_4_ < auVar91._0_4_) {
                bVar81 = uVar79 < 5;
                fVar202 = auVar86._0_4_ + (float)local_4f0._0_4_;
                bVar75 = 0;
                if ((fVar202 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar202))
                goto LAB_01a98220;
                auVar91 = vmovshdup_avx(auVar86);
                fVar141 = auVar91._0_4_;
                bVar75 = 0;
                if ((fVar141 < 0.0) || (bVar75 = 0, 1.0 < fVar141)) goto LAB_01a98220;
                auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_600._0_4_));
                fVar242 = auVar91._0_4_;
                fVar241 = local_600._0_4_ * -0.5;
                auVar230 = ZEXT464((uint)fVar241);
                pGVar3 = (context->scene->geometries).items[local_928].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar75 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a98220;
                  local_920._0_4_ = ray->tfar;
                  fVar241 = fVar242 * 1.5 + fVar241 * fVar242 * fVar242 * fVar242;
                  auVar215._0_4_ = local_700._0_4_ * fVar241;
                  auVar215._4_4_ = local_700._4_4_ * fVar241;
                  auVar215._8_4_ = local_700._8_4_ * fVar241;
                  auVar215._12_4_ = local_700._12_4_ * fVar241;
                  auVar84 = vfmadd213ps_fma(auVar84,auVar215,auVar87);
                  auVar91 = vshufps_avx(auVar215,auVar215,0xc9);
                  auVar92 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar216._0_4_ = auVar215._0_4_ * auVar92._0_4_;
                  auVar216._4_4_ = auVar215._4_4_ * auVar92._4_4_;
                  auVar216._8_4_ = auVar215._8_4_ * auVar92._8_4_;
                  auVar216._12_4_ = auVar215._12_4_ * auVar92._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar216,auVar87,auVar91);
                  auVar87 = vshufps_avx(auVar92,auVar92,0xc9);
                  auVar91 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar230 = ZEXT1664(auVar91);
                  auVar92 = vshufps_avx(auVar92,auVar92,0xd2);
                  auVar151._0_4_ = auVar84._0_4_ * auVar92._0_4_;
                  auVar151._4_4_ = auVar84._4_4_ * auVar92._4_4_;
                  auVar151._8_4_ = auVar84._8_4_ * auVar92._8_4_;
                  auVar151._12_4_ = auVar84._12_4_ * auVar92._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar151,auVar87,auVar91);
                  auVar87 = vshufps_avx(auVar92,auVar92,0xe9);
                  local_640 = vmovlps_avx(auVar87);
                  local_638 = auVar92._0_4_;
                  local_630 = 0;
                  local_62c = (undefined4)local_930;
                  local_628 = (undefined4)local_928;
                  local_624 = context->user->instID[0];
                  local_620 = context->user->instPrimID[0];
                  ray->tfar = fVar202;
                  local_934 = -1;
                  local_6d0.valid = &local_934;
                  local_6d0.geometryUserPtr = pGVar3->userPtr;
                  local_6d0.context = context->user;
                  local_6d0.hit = (RTCHitN *)&local_640;
                  local_6d0.N = 1;
                  local_7a0._0_8_ = pGVar3;
                  local_6d0.ray = (RTCRayN *)ray;
                  local_634 = fVar141;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a98495:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar230 = ZEXT1664(auVar230._0_16_);
                      auVar236 = ZEXT1664(auVar236._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      (*p_Var4)(&local_6d0);
                      auVar268 = ZEXT3264(local_900);
                      auVar267 = ZEXT3264(local_7c0);
                      auVar266 = ZEXT3264(local_760);
                      auVar265 = ZEXT3264(local_740);
                      auVar264 = ZEXT3264(local_8e0);
                      auVar262 = ZEXT3264(local_8c0);
                      auVar260 = ZEXT3264(local_8a0);
                      auVar259 = ZEXT3264(local_880);
                      auVar258 = ZEXT3264(local_860);
                      auVar257 = ZEXT3264(local_840);
                      auVar256 = ZEXT3264(local_820);
                      auVar255 = ZEXT3264(local_800);
                      auVar261 = ZEXT3264(local_7e0);
                      auVar263 = ZEXT3264(local_720);
                      auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      if (*local_6d0.valid == 0) goto LAB_01a9855c;
                    }
                    bVar75 = 1;
                    goto LAB_01a98220;
                  }
                  auVar230 = ZEXT1664(auVar91);
                  auVar236 = ZEXT1664(auVar233);
                  auVar240 = ZEXT1664(auVar239);
                  auVar244 = ZEXT1664(auVar86);
                  auVar247 = ZEXT1664(local_700._0_16_);
                  auVar252 = ZEXT1664(local_600._0_16_);
                  (*pGVar3->occlusionFilterN)(&local_6d0);
                  auVar268 = ZEXT3264(local_900);
                  auVar267 = ZEXT3264(local_7c0);
                  auVar266 = ZEXT3264(local_760);
                  auVar265 = ZEXT3264(local_740);
                  auVar264 = ZEXT3264(local_8e0);
                  auVar262 = ZEXT3264(local_8c0);
                  auVar260 = ZEXT3264(local_8a0);
                  auVar259 = ZEXT3264(local_880);
                  auVar258 = ZEXT3264(local_860);
                  auVar257 = ZEXT3264(local_840);
                  auVar256 = ZEXT3264(local_820);
                  auVar255 = ZEXT3264(local_800);
                  auVar261 = ZEXT3264(local_7e0);
                  auVar263 = ZEXT3264(local_720);
                  auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (*local_6d0.valid != 0) goto LAB_01a98495;
LAB_01a9855c:
                  ray->tfar = (float)local_920._0_4_;
                }
                bVar75 = 0;
                goto LAB_01a98220;
              }
            }
            uVar79 = uVar79 + 1;
          }
          bVar81 = false;
LAB_01a98220:
          bVar80 = bVar80 | bVar81 & bVar75;
          fVar141 = ray->tfar;
          auVar73._4_4_ = fStack_37c;
          auVar73._0_4_ = local_380;
          auVar73._8_4_ = fStack_378;
          auVar73._12_4_ = fStack_374;
          auVar73._16_4_ = fStack_370;
          auVar73._20_4_ = fStack_36c;
          auVar73._24_4_ = fStack_368;
          auVar73._28_4_ = fStack_364;
          fVar202 = ray->tfar;
          auVar37._4_4_ = fVar202;
          auVar37._0_4_ = fVar202;
          auVar37._8_4_ = fVar202;
          auVar37._12_4_ = fVar202;
          auVar37._16_4_ = fVar202;
          auVar37._20_4_ = fVar202;
          auVar37._24_4_ = fVar202;
          auVar37._28_4_ = fVar202;
          uVar15 = vcmpps_avx512vl(auVar73,auVar37,2);
        }
        uVar17 = vpcmpd_avx512vl(local_340,local_2a0,1);
        uVar16 = vpcmpd_avx512vl(local_340,_local_3c0,1);
        auVar197._0_4_ = (float)local_3e0._0_4_ + (float)local_2e0._0_4_;
        auVar197._4_4_ = (float)local_3e0._4_4_ + (float)local_2e0._4_4_;
        auVar197._8_4_ = fStack_3d8 + fStack_2d8;
        auVar197._12_4_ = fStack_3d4 + fStack_2d4;
        auVar197._16_4_ = fStack_3d0 + fStack_2d0;
        auVar197._20_4_ = fStack_3cc + fStack_2cc;
        auVar197._24_4_ = fStack_3c8 + fStack_2c8;
        auVar197._28_4_ = fStack_3c4 + fStack_2c4;
        auVar218._4_4_ = fVar141;
        auVar218._0_4_ = fVar141;
        auVar218._8_4_ = fVar141;
        auVar218._12_4_ = fVar141;
        auVar218._16_4_ = fVar141;
        auVar218._20_4_ = fVar141;
        auVar218._24_4_ = fVar141;
        auVar218._28_4_ = fVar141;
        uVar15 = vcmpps_avx512vl(auVar197,auVar218,2);
        bVar77 = (byte)local_764 & (byte)uVar17 & (byte)uVar15;
        auVar198._0_4_ = (float)local_3e0._0_4_ + (float)local_320._0_4_;
        auVar198._4_4_ = (float)local_3e0._4_4_ + (float)local_320._4_4_;
        auVar198._8_4_ = fStack_3d8 + fStack_318;
        auVar198._12_4_ = fStack_3d4 + fStack_314;
        auVar198._16_4_ = fStack_3d0 + fStack_310;
        auVar198._20_4_ = fStack_3cc + fStack_30c;
        auVar198._24_4_ = fStack_3c8 + fStack_308;
        auVar198._28_4_ = fStack_3c4 + fStack_304;
        uVar15 = vcmpps_avx512vl(auVar198,auVar218,2);
        bVar74 = bVar74 & (byte)uVar16 & (byte)uVar15 | bVar77;
        prim = local_610;
        if (bVar74 != 0) {
          uVar79 = (ulong)uVar76;
          abStack_180[uVar79 * 0x60] = bVar74;
          bVar81 = (bool)(bVar77 >> 1 & 1);
          bVar5 = (bool)(bVar77 >> 2 & 1);
          bVar6 = (bool)(bVar77 >> 3 & 1);
          bVar7 = (bool)(bVar77 >> 4 & 1);
          bVar8 = (bool)(bVar77 >> 5 & 1);
          bVar9 = (bool)(bVar77 >> 6 & 1);
          auStack_160[uVar79 * 0x18] =
               (uint)(bVar77 & 1) * local_2e0._0_4_ | (uint)!(bool)(bVar77 & 1) * local_320._0_4_;
          auStack_160[uVar79 * 0x18 + 1] =
               (uint)bVar81 * local_2e0._4_4_ | (uint)!bVar81 * local_320._4_4_;
          auStack_160[uVar79 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_2d8 | (uint)!bVar5 * (int)fStack_318;
          auStack_160[uVar79 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_2d4 | (uint)!bVar6 * (int)fStack_314;
          auStack_160[uVar79 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_2d0 | (uint)!bVar7 * (int)fStack_310;
          auStack_160[uVar79 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_2cc | (uint)!bVar8 * (int)fStack_30c;
          auStack_160[uVar79 * 0x18 + 6] =
               (uint)bVar9 * (int)fStack_2c8 | (uint)!bVar9 * (int)fStack_308;
          auStack_160[uVar79 * 0x18 + 7] =
               (uint)(bVar77 >> 7) * (int)fStack_2c4 | (uint)!(bool)(bVar77 >> 7) * (int)fStack_304;
          uVar82 = vmovlps_avx(local_350);
          (&uStack_140)[uVar79 * 0xc] = uVar82;
          aiStack_138[uVar79 * 0x18] = local_944 + 1;
          uVar76 = uVar76 + 1;
        }
      }
    }
    fVar202 = ray->tfar;
    auVar153._4_4_ = fVar202;
    auVar153._0_4_ = fVar202;
    auVar153._8_4_ = fVar202;
    auVar153._12_4_ = fVar202;
    auVar153._16_4_ = fVar202;
    auVar153._20_4_ = fVar202;
    auVar153._24_4_ = fVar202;
    auVar153._28_4_ = fVar202;
    do {
      uVar83 = uVar76;
      uVar134 = uVar83 - 1;
      if (uVar83 == 0) {
        if (bVar80 != 0) goto LAB_01a986c0;
        uVar15 = vcmpps_avx512vl(auVar153,local_280,0xd);
        local_608 = (ulong)((uint)local_488 & (uint)uVar15);
        goto LAB_01a95e25;
      }
      uVar82 = (ulong)uVar134;
      auVar98 = *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x18);
      auVar195._0_4_ = auVar98._0_4_ + (float)local_3e0._0_4_;
      auVar195._4_4_ = auVar98._4_4_ + (float)local_3e0._4_4_;
      auVar195._8_4_ = auVar98._8_4_ + fStack_3d8;
      auVar195._12_4_ = auVar98._12_4_ + fStack_3d4;
      auVar195._16_4_ = auVar98._16_4_ + fStack_3d0;
      auVar195._20_4_ = auVar98._20_4_ + fStack_3cc;
      auVar195._24_4_ = auVar98._24_4_ + fStack_3c8;
      auVar195._28_4_ = auVar98._28_4_ + fStack_3c4;
      uVar15 = vcmpps_avx512vl(auVar195,auVar153,2);
      uVar135 = (uint)uVar15 & (uint)abStack_180[uVar82 * 0x60];
      uVar76 = uVar134;
    } while (uVar135 == 0);
    uVar79 = (&uStack_140)[uVar82 * 0xc];
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar79;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar97 = vblendmps_avx512vl(auVar196,auVar98);
    bVar74 = (byte)uVar135;
    auVar131._0_4_ =
         (uint)(bVar74 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar98._0_4_;
    bVar81 = (bool)((byte)(uVar135 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar81 * auVar97._4_4_ | (uint)!bVar81 * (int)auVar98._4_4_;
    bVar81 = (bool)((byte)(uVar135 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar81 * auVar97._8_4_ | (uint)!bVar81 * (int)auVar98._8_4_;
    bVar81 = (bool)((byte)(uVar135 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar81 * auVar97._12_4_ | (uint)!bVar81 * (int)auVar98._12_4_;
    bVar81 = (bool)((byte)(uVar135 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar81 * auVar97._16_4_ | (uint)!bVar81 * (int)auVar98._16_4_;
    bVar81 = (bool)((byte)(uVar135 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar81 * auVar97._20_4_ | (uint)!bVar81 * (int)auVar98._20_4_;
    bVar81 = (bool)((byte)(uVar135 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar81 * auVar97._24_4_ | (uint)!bVar81 * (int)auVar98._24_4_;
    auVar131._28_4_ =
         (uVar135 >> 7) * auVar97._28_4_ | (uint)!SUB41(uVar135 >> 7,0) * (int)auVar98._28_4_;
    auVar98 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar98 = vminps_avx(auVar131,auVar98);
    auVar97 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar97);
    auVar97 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar97);
    uVar15 = vcmpps_avx512vl(auVar131,auVar98,0);
    bVar77 = (byte)uVar15 & bVar74;
    if (bVar77 != 0) {
      uVar135 = (uint)bVar77;
    }
    uVar136 = 0;
    for (; (uVar135 & 1) == 0; uVar135 = uVar135 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_944 = aiStack_138[uVar82 * 0x18];
    bVar74 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar74;
    abStack_180[uVar82 * 0x60] = bVar74;
    uVar76 = uVar83;
    if (bVar74 == 0) {
      uVar76 = uVar134;
    }
    uVar143 = (undefined4)uVar79;
    auVar175._4_4_ = uVar143;
    auVar175._0_4_ = uVar143;
    auVar175._8_4_ = uVar143;
    auVar175._12_4_ = uVar143;
    auVar175._16_4_ = uVar143;
    auVar175._20_4_ = uVar143;
    auVar175._24_4_ = uVar143;
    auVar175._28_4_ = uVar143;
    auVar86 = vmovshdup_avx(auVar145);
    auVar86 = vsubps_avx(auVar86,auVar145);
    auVar154._0_4_ = auVar86._0_4_;
    auVar154._4_4_ = auVar154._0_4_;
    auVar154._8_4_ = auVar154._0_4_;
    auVar154._12_4_ = auVar154._0_4_;
    auVar154._16_4_ = auVar154._0_4_;
    auVar154._20_4_ = auVar154._0_4_;
    auVar154._24_4_ = auVar154._0_4_;
    auVar154._28_4_ = auVar154._0_4_;
    auVar86 = vfmadd132ps_fma(auVar154,auVar175,_DAT_01f7b040);
    _local_2e0 = ZEXT1632(auVar86);
    local_350._8_8_ = 0;
    local_350._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar136 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }